

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

bool embree::avx2::CurveNiIntersectorK<4,8>::
     occluded_t<embree::avx2::SweepCurve1IntersectorK<embree::BezierCurveT,8>,embree::avx2::Occluded1KEpilog1<8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  Primitive PVar1;
  Geometry *pGVar2;
  RTCFilterFunctionN p_Var3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  bool bVar55;
  undefined1 auVar56 [12];
  bool bVar57;
  bool bVar58;
  bool bVar59;
  ulong uVar60;
  bool bVar61;
  bool bVar62;
  bool bVar63;
  bool bVar64;
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  uint uVar78;
  int iVar79;
  uint uVar80;
  ulong uVar81;
  byte unaff_BL;
  long lVar82;
  uint uVar83;
  ulong uVar84;
  undefined4 uVar85;
  ulong uVar86;
  float fVar87;
  float fVar89;
  undefined8 uVar90;
  float fVar123;
  vint4 bi_2;
  undefined1 auVar91 [16];
  float fVar122;
  float fVar124;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined4 uVar88;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 extraout_var [60];
  undefined1 auVar120 [64];
  undefined1 auVar121 [64];
  float fVar125;
  float fVar154;
  float fVar155;
  vint4 bi_1;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  float fVar157;
  float fVar158;
  float fVar159;
  undefined1 auVar144 [32];
  float fVar156;
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  float fVar176;
  float fVar177;
  float fVar178;
  float fVar179;
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  float fVar180;
  vint4 ai_2;
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  float fVar203;
  float fVar214;
  float fVar215;
  vint4 ai;
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar209 [28];
  float fVar217;
  float fVar218;
  undefined1 auVar210 [32];
  float fVar216;
  float fVar219;
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar208 [16];
  undefined1 auVar213 [32];
  vint4 bi;
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar237 [32];
  float fVar239;
  undefined1 auVar238 [64];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  float fVar248;
  float fVar254;
  float fVar255;
  undefined1 auVar249 [16];
  undefined1 auVar250 [28];
  float fVar256;
  float fVar257;
  float fVar258;
  float fVar259;
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  vint4 ai_1;
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  undefined1 auVar266 [32];
  undefined1 auVar267 [16];
  undefined1 auVar268 [32];
  undefined1 auVar269 [64];
  float fVar273;
  float fVar274;
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  float fVar275;
  undefined1 auVar272 [32];
  undefined1 auVar276 [16];
  float fVar279;
  float fVar280;
  float fVar281;
  float fVar282;
  undefined1 auVar277 [64];
  undefined1 auVar278 [64];
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  undefined1 auVar285 [32];
  undefined1 auVar286 [32];
  undefined1 auVar287 [32];
  float fVar292;
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  float fVar293;
  float fVar294;
  undefined1 auVar291 [32];
  float fVar297;
  float fVar298;
  float fVar299;
  undefined1 auVar295 [32];
  undefined1 auVar296 [32];
  RTCFilterFunctionNArguments args;
  float P_err;
  Vec3fa dir;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  BBox<embree::vfloat_impl<8>_> tp0;
  vboolx_conflict valid;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  bool local_cc9;
  float fStack_b7c;
  float fStack_b78;
  float fStack_b74;
  undefined1 local_b40 [32];
  RTCFilterFunctionNArguments local_ad0;
  undefined1 local_aa0 [32];
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  undefined1 local_a20 [16];
  undefined4 uStack_a10;
  undefined4 uStack_a0c;
  undefined4 uStack_a08;
  undefined4 uStack_a04;
  undefined1 local_9f0 [16];
  undefined1 local_9e0 [16];
  undefined1 local_9d0 [16];
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [8];
  float fStack_998;
  float fStack_994;
  float fStack_990;
  float fStack_98c;
  float fStack_988;
  undefined1 local_980 [8];
  float fStack_978;
  float fStack_974;
  float fStack_970;
  float fStack_96c;
  float fStack_968;
  float fStack_964;
  undefined1 local_960 [32];
  undefined1 local_940 [8];
  float fStack_938;
  float fStack_934;
  undefined1 auStack_930 [16];
  undefined8 local_920;
  undefined8 uStack_918;
  undefined8 uStack_910;
  undefined8 uStack_908;
  undefined1 local_8f0 [16];
  undefined1 local_8e0 [16];
  Primitive *local_8d0;
  ulong local_8c8;
  undefined1 local_8c0 [8];
  float fStack_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  float fStack_8a8;
  undefined1 local_8a0 [32];
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  float fStack_864;
  undefined4 local_860;
  undefined4 uStack_85c;
  undefined4 uStack_858;
  undefined4 uStack_854;
  undefined4 uStack_850;
  undefined4 uStack_84c;
  undefined4 uStack_848;
  undefined4 uStack_844;
  undefined1 local_840 [8];
  float fStack_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  float fStack_824;
  undefined1 local_820 [32];
  undefined1 local_800 [16];
  undefined1 auStack_7f0 [16];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  ulong local_760;
  undefined1 auStack_758 [24];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  float fStack_6e4;
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  float fStack_664;
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5b0 [16];
  undefined1 local_5a0 [32];
  uint local_580;
  uint uStack_57c;
  uint uStack_578;
  uint uStack_574;
  uint uStack_570;
  uint uStack_56c;
  uint uStack_568;
  uint uStack_564;
  uint local_560;
  uint uStack_55c;
  uint uStack_558;
  uint uStack_554;
  uint uStack_550;
  uint uStack_54c;
  uint uStack_548;
  uint uStack_544;
  undefined1 local_540 [32];
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  float local_500;
  float fStack_4fc;
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  float local_4e0;
  float fStack_4dc;
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  RTCHitN local_480 [32];
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 uStack_450;
  undefined8 uStack_448;
  undefined4 local_440;
  undefined4 uStack_43c;
  undefined4 uStack_438;
  undefined4 uStack_434;
  undefined4 uStack_430;
  undefined4 uStack_42c;
  undefined4 uStack_428;
  undefined4 uStack_424;
  float local_420;
  float fStack_41c;
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  undefined1 local_400 [32];
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  uint local_3a0;
  uint uStack_39c;
  uint uStack_398;
  uint uStack_394;
  uint uStack_390;
  uint uStack_38c;
  uint uStack_388;
  uint uStack_384;
  uint local_380;
  uint uStack_37c;
  uint uStack_378;
  uint uStack_374;
  uint uStack_370;
  uint uStack_36c;
  uint uStack_368;
  uint uStack_364;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  float local_2e0;
  float fStack_2dc;
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  float local_2c0;
  float fStack_2bc;
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  float local_220;
  float fStack_21c;
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined1 local_200 [32];
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  float afStack_140 [2];
  uint auStack_138 [66];
  undefined1 extraout_var_00 [60];
  undefined1 auVar229 [32];
  
  PVar1 = prim[1];
  uVar86 = (ulong)(byte)PVar1;
  auVar4 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x10
                        );
  auVar4 = vinsertps_avx(auVar4,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar5 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                         ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar5 = vinsertps_avx(auVar5,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  fVar87 = *(float *)(prim + uVar86 * 0x19 + 0x12);
  auVar4 = vsubps_avx(auVar4,*(undefined1 (*) [16])(prim + uVar86 * 0x19 + 6));
  auVar91._0_4_ = fVar87 * auVar4._0_4_;
  auVar91._4_4_ = fVar87 * auVar4._4_4_;
  auVar91._8_4_ = fVar87 * auVar4._8_4_;
  auVar91._12_4_ = fVar87 * auVar4._12_4_;
  auVar220._0_4_ = fVar87 * auVar5._0_4_;
  auVar220._4_4_ = fVar87 * auVar5._4_4_;
  auVar220._8_4_ = fVar87 * auVar5._8_4_;
  auVar220._12_4_ = fVar87 * auVar5._12_4_;
  auVar4 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar86 * 4 + 6)));
  auVar4 = vcvtdq2ps_avx(auVar4);
  auVar5 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar86 * 5 + 6)));
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar6 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar86 * 6 + 6)));
  auVar6 = vcvtdq2ps_avx(auVar6);
  auVar7 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar86 * 0xb + 6)));
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar8 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar1 * 0xc) + 6)));
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar9 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar1 * 0xc + uVar86 + 6)));
  auVar9 = vcvtdq2ps_avx(auVar9);
  uVar81 = (ulong)(uint)((int)(uVar86 * 9) * 2);
  auVar94 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 + 6)));
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar93 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 + uVar86 + 6)));
  auVar93 = vcvtdq2ps_avx(auVar93);
  uVar81 = (ulong)(uint)((int)(uVar86 * 5) << 2);
  auVar160 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 + 6)));
  auVar160 = vcvtdq2ps_avx(auVar160);
  auVar288._4_4_ = auVar220._0_4_;
  auVar288._0_4_ = auVar220._0_4_;
  auVar288._8_4_ = auVar220._0_4_;
  auVar288._12_4_ = auVar220._0_4_;
  auVar99 = vshufps_avx(auVar220,auVar220,0x55);
  auVar92 = vshufps_avx(auVar220,auVar220,0xaa);
  fVar87 = auVar92._0_4_;
  auVar276._0_4_ = fVar87 * auVar6._0_4_;
  fVar122 = auVar92._4_4_;
  auVar276._4_4_ = fVar122 * auVar6._4_4_;
  fVar123 = auVar92._8_4_;
  auVar276._8_4_ = fVar123 * auVar6._8_4_;
  fVar124 = auVar92._12_4_;
  auVar276._12_4_ = fVar124 * auVar6._12_4_;
  auVar270._0_4_ = auVar9._0_4_ * fVar87;
  auVar270._4_4_ = auVar9._4_4_ * fVar122;
  auVar270._8_4_ = auVar9._8_4_ * fVar123;
  auVar270._12_4_ = auVar9._12_4_ * fVar124;
  auVar260._0_4_ = auVar160._0_4_ * fVar87;
  auVar260._4_4_ = auVar160._4_4_ * fVar122;
  auVar260._8_4_ = auVar160._8_4_ * fVar123;
  auVar260._12_4_ = auVar160._12_4_ * fVar124;
  auVar92 = vfmadd231ps_fma(auVar276,auVar99,auVar5);
  auVar126 = vfmadd231ps_fma(auVar270,auVar99,auVar8);
  auVar99 = vfmadd231ps_fma(auVar260,auVar93,auVar99);
  auVar181 = vfmadd231ps_fma(auVar92,auVar288,auVar4);
  auVar126 = vfmadd231ps_fma(auVar126,auVar288,auVar7);
  auVar204 = vfmadd231ps_fma(auVar99,auVar94,auVar288);
  auVar289._4_4_ = auVar91._0_4_;
  auVar289._0_4_ = auVar91._0_4_;
  auVar289._8_4_ = auVar91._0_4_;
  auVar289._12_4_ = auVar91._0_4_;
  auVar99 = vshufps_avx(auVar91,auVar91,0x55);
  auVar92 = vshufps_avx(auVar91,auVar91,0xaa);
  fVar87 = auVar92._0_4_;
  auVar221._0_4_ = fVar87 * auVar6._0_4_;
  fVar122 = auVar92._4_4_;
  auVar221._4_4_ = fVar122 * auVar6._4_4_;
  fVar123 = auVar92._8_4_;
  auVar221._8_4_ = fVar123 * auVar6._8_4_;
  fVar124 = auVar92._12_4_;
  auVar221._12_4_ = fVar124 * auVar6._12_4_;
  auVar133._0_4_ = auVar9._0_4_ * fVar87;
  auVar133._4_4_ = auVar9._4_4_ * fVar122;
  auVar133._8_4_ = auVar9._8_4_ * fVar123;
  auVar133._12_4_ = auVar9._12_4_ * fVar124;
  auVar92._0_4_ = auVar160._0_4_ * fVar87;
  auVar92._4_4_ = auVar160._4_4_ * fVar122;
  auVar92._8_4_ = auVar160._8_4_ * fVar123;
  auVar92._12_4_ = auVar160._12_4_ * fVar124;
  auVar5 = vfmadd231ps_fma(auVar221,auVar99,auVar5);
  auVar6 = vfmadd231ps_fma(auVar133,auVar99,auVar8);
  auVar8 = vfmadd231ps_fma(auVar92,auVar99,auVar93);
  auVar9 = vfmadd231ps_fma(auVar5,auVar289,auVar4);
  auVar93 = vfmadd231ps_fma(auVar6,auVar289,auVar7);
  auVar160 = vfmadd231ps_fma(auVar8,auVar289,auVar94);
  local_9e0._8_4_ = 0x7fffffff;
  local_9e0._0_8_ = 0x7fffffff7fffffff;
  local_9e0._12_4_ = 0x7fffffff;
  auVar4 = vandps_avx(auVar181,local_9e0);
  auVar164._8_4_ = 0x219392ef;
  auVar164._0_8_ = 0x219392ef219392ef;
  auVar164._12_4_ = 0x219392ef;
  auVar4 = vcmpps_avx(auVar4,auVar164,1);
  auVar5 = vblendvps_avx(auVar181,auVar164,auVar4);
  auVar4 = vandps_avx(auVar126,local_9e0);
  auVar4 = vcmpps_avx(auVar4,auVar164,1);
  auVar6 = vblendvps_avx(auVar126,auVar164,auVar4);
  auVar4 = vandps_avx(auVar204,local_9e0);
  auVar4 = vcmpps_avx(auVar4,auVar164,1);
  auVar4 = vblendvps_avx(auVar204,auVar164,auVar4);
  auVar7 = vrcpps_avx(auVar5);
  auVar249._8_4_ = 0x3f800000;
  auVar249._0_8_ = &DAT_3f8000003f800000;
  auVar249._12_4_ = 0x3f800000;
  auVar5 = vfnmadd213ps_fma(auVar5,auVar7,auVar249);
  auVar7 = vfmadd132ps_fma(auVar5,auVar7,auVar7);
  auVar5 = vrcpps_avx(auVar6);
  auVar6 = vfnmadd213ps_fma(auVar6,auVar5,auVar249);
  auVar8 = vfmadd132ps_fma(auVar6,auVar5,auVar5);
  auVar5 = vrcpps_avx(auVar4);
  auVar6 = vfnmadd213ps_fma(auVar4,auVar5,auVar249);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)(prim + uVar86 * 7 + 6);
  auVar4 = vpmovsxwd_avx(auVar4);
  auVar94 = vfmadd132ps_fma(auVar6,auVar5,auVar5);
  auVar4 = vcvtdq2ps_avx(auVar4);
  auVar4 = vsubps_avx(auVar4,auVar9);
  auVar204._0_4_ = auVar7._0_4_ * auVar4._0_4_;
  auVar204._4_4_ = auVar7._4_4_ * auVar4._4_4_;
  auVar204._8_4_ = auVar7._8_4_ * auVar4._8_4_;
  auVar204._12_4_ = auVar7._12_4_ * auVar4._12_4_;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + uVar86 * 9 + 6);
  auVar4 = vpmovsxwd_avx(auVar5);
  auVar4 = vcvtdq2ps_avx(auVar4);
  auVar4 = vsubps_avx(auVar4,auVar9);
  auVar222._0_4_ = auVar7._0_4_ * auVar4._0_4_;
  auVar222._4_4_ = auVar7._4_4_ * auVar4._4_4_;
  auVar222._8_4_ = auVar7._8_4_ * auVar4._8_4_;
  auVar222._12_4_ = auVar7._12_4_ * auVar4._12_4_;
  auVar126._1_3_ = 0;
  auVar126[0] = PVar1;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar1 * 0x10 + 6);
  auVar5 = vpmovsxwd_avx(auVar6);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar1 * 0x10 + uVar86 * -2 + 6);
  auVar4 = vpmovsxwd_avx(auVar7);
  auVar4 = vcvtdq2ps_avx(auVar4);
  auVar4 = vsubps_avx(auVar4,auVar93);
  auVar261._0_4_ = auVar4._0_4_ * auVar8._0_4_;
  auVar261._4_4_ = auVar4._4_4_ * auVar8._4_4_;
  auVar261._8_4_ = auVar4._8_4_ * auVar8._8_4_;
  auVar261._12_4_ = auVar4._12_4_ * auVar8._12_4_;
  auVar4 = vcvtdq2ps_avx(auVar5);
  auVar4 = vsubps_avx(auVar4,auVar93);
  auVar99._0_4_ = auVar8._0_4_ * auVar4._0_4_;
  auVar99._4_4_ = auVar8._4_4_ * auVar4._4_4_;
  auVar99._8_4_ = auVar8._8_4_ * auVar4._8_4_;
  auVar99._12_4_ = auVar8._12_4_ * auVar4._12_4_;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar81 + uVar86 + 6);
  auVar4 = vpmovsxwd_avx(auVar8);
  auVar4 = vcvtdq2ps_avx(auVar4);
  auVar4 = vsubps_avx(auVar4,auVar160);
  auVar181._0_4_ = auVar94._0_4_ * auVar4._0_4_;
  auVar181._4_4_ = auVar94._4_4_ * auVar4._4_4_;
  auVar181._8_4_ = auVar94._8_4_ * auVar4._8_4_;
  auVar181._12_4_ = auVar94._12_4_ * auVar4._12_4_;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar86 * 0x17 + 6);
  auVar4 = vpmovsxwd_avx(auVar9);
  auVar4 = vcvtdq2ps_avx(auVar4);
  auVar4 = vsubps_avx(auVar4,auVar160);
  auVar93._0_4_ = auVar94._0_4_ * auVar4._0_4_;
  auVar93._4_4_ = auVar94._4_4_ * auVar4._4_4_;
  auVar93._8_4_ = auVar94._8_4_ * auVar4._8_4_;
  auVar93._12_4_ = auVar94._12_4_ * auVar4._12_4_;
  auVar4 = vpminsd_avx(auVar204,auVar222);
  auVar5 = vpminsd_avx(auVar261,auVar99);
  auVar4 = vmaxps_avx(auVar4,auVar5);
  auVar5 = vpminsd_avx(auVar181,auVar93);
  uVar88 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar267._4_4_ = uVar88;
  auVar267._0_4_ = uVar88;
  auVar267._8_4_ = uVar88;
  auVar267._12_4_ = uVar88;
  auVar5 = vmaxps_avx(auVar5,auVar267);
  auVar4 = vmaxps_avx(auVar4,auVar5);
  local_5b0._0_4_ = auVar4._0_4_ * 0.99999964;
  local_5b0._4_4_ = auVar4._4_4_ * 0.99999964;
  local_5b0._8_4_ = auVar4._8_4_ * 0.99999964;
  local_5b0._12_4_ = auVar4._12_4_ * 0.99999964;
  auVar4 = vpmaxsd_avx(auVar204,auVar222);
  auVar5 = vpmaxsd_avx(auVar261,auVar99);
  auVar4 = vminps_avx(auVar4,auVar5);
  auVar5 = vpmaxsd_avx(auVar181,auVar93);
  uVar88 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar160._4_4_ = uVar88;
  auVar160._0_4_ = uVar88;
  auVar160._8_4_ = uVar88;
  auVar160._12_4_ = uVar88;
  auVar5 = vminps_avx(auVar5,auVar160);
  auVar4 = vminps_avx(auVar4,auVar5);
  auVar94._0_4_ = auVar4._0_4_ * 1.0000004;
  auVar94._4_4_ = auVar4._4_4_ * 1.0000004;
  auVar94._8_4_ = auVar4._8_4_ * 1.0000004;
  auVar94._12_4_ = auVar4._12_4_ * 1.0000004;
  auVar126[4] = PVar1;
  auVar126._5_3_ = 0;
  auVar126[8] = PVar1;
  auVar126._9_3_ = 0;
  auVar126[0xc] = PVar1;
  auVar126._13_3_ = 0;
  auVar5 = vpcmpgtd_avx(auVar126,_DAT_01ff0cf0);
  auVar4 = vcmpps_avx(local_5b0,auVar94,2);
  auVar4 = vandps_avx(auVar4,auVar5);
  uVar78 = vmovmskps_avx(auVar4);
  local_cc9 = uVar78 != 0;
  if (uVar78 == 0) {
    return local_cc9;
  }
  auVar114._16_16_ = mm_lookupmask_ps._240_16_;
  auVar114._0_16_ = mm_lookupmask_ps._240_16_;
  uVar78 = uVar78 & 0xff;
  local_260 = vblendps_avx(auVar114,ZEXT832(0) << 0x20,0x80);
  iVar79 = 1 << ((uint)k & 0x1f);
  auVar107._4_4_ = iVar79;
  auVar107._0_4_ = iVar79;
  auVar107._8_4_ = iVar79;
  auVar107._12_4_ = iVar79;
  auVar107._16_4_ = iVar79;
  auVar107._20_4_ = iVar79;
  auVar107._24_4_ = iVar79;
  auVar107._28_4_ = iVar79;
  auVar265 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar114 = vpand_avx2(auVar107,auVar265);
  local_5a0 = vpcmpeqd_avx2(auVar114,auVar265);
  local_860 = 0x7fffffff;
  uStack_85c = 0x7fffffff;
  uStack_858 = 0x7fffffff;
  uStack_854 = 0x7fffffff;
  uStack_850 = 0x7fffffff;
  uStack_84c = 0x7fffffff;
  uStack_848 = 0x7fffffff;
  uStack_844 = 0x7fffffff;
  local_8d0 = prim;
LAB_016eb6c8:
  lVar82 = 0;
  local_8c8 = (ulong)uVar78;
  for (uVar81 = local_8c8; (uVar81 & 1) == 0; uVar81 = uVar81 >> 1 | 0x8000000000000000) {
    lVar82 = lVar82 + 1;
  }
  uVar78 = *(uint *)(local_8d0 + 2);
  local_580 = *(uint *)(local_8d0 + lVar82 * 4 + 6);
  pGVar2 = (context->scene->geometries).items[uVar78].ptr;
  uVar81 = (ulong)*(uint *)(*(long *)&pGVar2->field_0x58 +
                           pGVar2[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)local_580);
  p_Var3 = pGVar2[1].intersectionFilterN;
  lVar82 = *(long *)&pGVar2[1].time_range.upper;
  auVar4 = *(undefined1 (*) [16])(lVar82 + (long)p_Var3 * uVar81);
  auVar5 = *(undefined1 (*) [16])(lVar82 + (uVar81 + 1) * (long)p_Var3);
  auVar6 = *(undefined1 (*) [16])(lVar82 + (uVar81 + 2) * (long)p_Var3);
  local_8c8 = local_8c8 - 1 & local_8c8;
  auVar7 = *(undefined1 (*) [16])(lVar82 + (uVar81 + 3) * (long)p_Var3);
  if (local_8c8 != 0) {
    uVar86 = local_8c8 - 1 & local_8c8;
    for (uVar81 = local_8c8; (uVar81 & 1) == 0; uVar81 = uVar81 >> 1 | 0x8000000000000000) {
    }
    if (uVar86 != 0) {
      for (; (uVar86 & 1) == 0; uVar86 = uVar86 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar8 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x1c
                        );
  auVar9 = vinsertps_avx(auVar8,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  fVar87 = *(float *)(ray + k * 4 + 0x80);
  auVar223._4_4_ = fVar87;
  auVar223._0_4_ = fVar87;
  auVar223._8_4_ = fVar87;
  auVar223._12_4_ = fVar87;
  auVar229._16_4_ = fVar87;
  auVar229._0_16_ = auVar223;
  auVar229._20_4_ = fVar87;
  auVar229._24_4_ = fVar87;
  auVar229._28_4_ = fVar87;
  uVar88 = *(undefined4 *)(ray + k * 4 + 0xa0);
  auVar290._4_4_ = uVar88;
  auVar290._0_4_ = uVar88;
  auVar290._8_4_ = uVar88;
  auVar290._12_4_ = uVar88;
  fStack_990 = (float)uVar88;
  _local_9a0 = auVar290;
  fStack_98c = (float)uVar88;
  fStack_988 = (float)uVar88;
  register0x0000159c = uVar88;
  auVar8 = vunpcklps_avx(auVar223,auVar290);
  fVar122 = *(float *)(ray + k * 4 + 0xc0);
  auVar271._4_4_ = fVar122;
  auVar271._0_4_ = fVar122;
  auVar271._8_4_ = fVar122;
  auVar271._12_4_ = fVar122;
  local_aa0._16_4_ = fVar122;
  local_aa0._0_16_ = auVar271;
  local_aa0._20_4_ = fVar122;
  local_aa0._24_4_ = fVar122;
  local_aa0._28_4_ = fVar122;
  local_9d0 = vinsertps_avx(auVar8,auVar271,0x28);
  auVar224._0_4_ = (auVar4._0_4_ + auVar5._0_4_ + auVar6._0_4_ + auVar7._0_4_) * 0.25;
  auVar224._4_4_ = (auVar4._4_4_ + auVar5._4_4_ + auVar6._4_4_ + auVar7._4_4_) * 0.25;
  auVar224._8_4_ = (auVar4._8_4_ + auVar5._8_4_ + auVar6._8_4_ + auVar7._8_4_) * 0.25;
  auVar224._12_4_ = (auVar4._12_4_ + auVar5._12_4_ + auVar6._12_4_ + auVar7._12_4_) * 0.25;
  auVar8 = vsubps_avx(auVar224,auVar9);
  auVar8 = vdpps_avx(auVar8,local_9d0,0x7f);
  local_9f0 = vdpps_avx(local_9d0,local_9d0,0x7f);
  auVar269 = ZEXT1664(local_9f0);
  auVar94 = vrcpss_avx(local_9f0,local_9f0);
  auVar93 = vfnmadd213ss_fma(auVar94,local_9f0,ZEXT416(0x40000000));
  local_2e0 = auVar8._0_4_ * auVar94._0_4_ * auVar93._0_4_;
  auVar240._4_4_ = local_2e0;
  auVar240._0_4_ = local_2e0;
  auVar240._8_4_ = local_2e0;
  auVar240._12_4_ = local_2e0;
  fStack_970 = local_2e0;
  _local_980 = auVar240;
  fStack_96c = local_2e0;
  fStack_968 = local_2e0;
  fStack_964 = local_2e0;
  auVar8 = vfmadd231ps_fma(auVar9,local_9d0,auVar240);
  auVar8 = vblendps_avx(auVar8,_DAT_01feba10,8);
  auVar9 = vsubps_avx(auVar4,auVar8);
  auVar277 = ZEXT1664(auVar9);
  auVar94 = vsubps_avx(auVar6,auVar8);
  auVar93 = vsubps_avx(auVar5,auVar8);
  auVar160 = vsubps_avx(auVar7,auVar8);
  auVar4 = vmovshdup_avx(auVar9);
  local_520 = auVar4._0_8_;
  uStack_518 = local_520;
  uStack_510 = local_520;
  uStack_508 = local_520;
  auVar4 = vshufps_avx(auVar9,auVar9,0xaa);
  uVar90 = auVar4._0_8_;
  local_9c0._8_8_ = uVar90;
  local_9c0._0_8_ = uVar90;
  local_9c0._16_8_ = uVar90;
  local_9c0._24_8_ = uVar90;
  auVar4 = vshufps_avx(auVar9,auVar9,0xff);
  uVar90 = auVar4._0_8_;
  local_620._8_8_ = uVar90;
  local_620._0_8_ = uVar90;
  local_620._16_8_ = uVar90;
  local_620._24_8_ = uVar90;
  auVar4 = vmovshdup_avx(auVar93);
  uVar90 = auVar4._0_8_;
  auVar285._8_8_ = uVar90;
  auVar285._0_8_ = uVar90;
  auVar285._16_8_ = uVar90;
  auVar285._24_8_ = uVar90;
  auVar6 = vshufps_avx(auVar93,auVar93,0xaa);
  uVar90 = auVar6._0_8_;
  auVar283._8_8_ = uVar90;
  auVar283._0_8_ = uVar90;
  auVar283._16_8_ = uVar90;
  auVar283._24_8_ = uVar90;
  auVar5 = vshufps_avx(auVar93,auVar93,0xff);
  uVar90 = auVar5._0_8_;
  local_280._8_8_ = uVar90;
  local_280._0_8_ = uVar90;
  local_280._16_8_ = uVar90;
  local_280._24_8_ = uVar90;
  auVar5 = vmovshdup_avx(auVar94);
  local_4e0 = auVar5._0_4_;
  fStack_4dc = auVar5._4_4_;
  auVar7 = vshufps_avx(auVar94,auVar94,0xaa);
  uVar90 = auVar7._0_8_;
  auVar243._8_8_ = uVar90;
  auVar243._0_8_ = uVar90;
  auVar243._16_8_ = uVar90;
  auVar243._24_8_ = uVar90;
  auVar5 = vshufps_avx(auVar94,auVar94,0xff);
  local_500 = auVar5._0_4_;
  fStack_4fc = auVar5._4_4_;
  auVar5 = vmovshdup_avx(auVar160);
  local_1a0 = auVar5._0_8_;
  uStack_198 = local_1a0;
  uStack_190 = local_1a0;
  uStack_188 = local_1a0;
  auVar5 = vshufps_avx(auVar160,auVar160,0xaa);
  local_1c0 = auVar5._0_8_;
  uStack_1b8 = local_1c0;
  uStack_1b0 = local_1c0;
  uStack_1a8 = local_1c0;
  auVar5 = vshufps_avx(auVar160,auVar160,0xff);
  local_1e0 = auVar5._0_8_;
  uStack_1d8 = local_1e0;
  uStack_1d0 = local_1e0;
  uStack_1c8 = local_1e0;
  auVar5 = vfmadd231ps_fma(ZEXT432((uint)(fVar122 * fVar122)),_local_9a0,_local_9a0);
  auVar5 = vfmadd231ps_fma(ZEXT1632(auVar5),auVar229,auVar229);
  uVar88 = auVar5._0_4_;
  local_200._4_4_ = uVar88;
  local_200._0_4_ = uVar88;
  local_200._8_4_ = uVar88;
  local_200._12_4_ = uVar88;
  local_200._16_4_ = uVar88;
  local_200._20_4_ = uVar88;
  local_200._24_4_ = uVar88;
  local_200._28_4_ = uVar88;
  fVar122 = *(float *)(ray + k * 4 + 0x60);
  local_8f0 = ZEXT416((uint)local_2e0);
  local_2e0 = fVar122 - local_2e0;
  auVar238 = ZEXT3264(local_9c0);
  fStack_2dc = local_2e0;
  fStack_2d8 = local_2e0;
  fStack_2d4 = local_2e0;
  fStack_2d0 = local_2e0;
  fStack_2cc = local_2e0;
  fStack_2c8 = local_2e0;
  fStack_2c4 = local_2e0;
  local_560 = uVar78;
  uStack_55c = uVar78;
  uStack_558 = uVar78;
  uStack_554 = uVar78;
  uStack_550 = uVar78;
  uStack_54c = uVar78;
  uStack_548 = uVar78;
  uStack_544 = uVar78;
  uStack_57c = local_580;
  uStack_578 = local_580;
  uStack_574 = local_580;
  uStack_570 = local_580;
  uStack_56c = local_580;
  uStack_568 = local_580;
  uStack_564 = local_580;
  uVar86 = 0;
  uVar84 = 0;
  uVar88 = auVar9._0_4_;
  auVar103._4_4_ = uVar88;
  auVar103._0_4_ = uVar88;
  auVar103._8_4_ = uVar88;
  auVar103._12_4_ = uVar88;
  auVar103._16_4_ = uVar88;
  auVar103._20_4_ = uVar88;
  auVar103._24_4_ = uVar88;
  auVar103._28_4_ = uVar88;
  fVar123 = auVar93._0_4_;
  local_2a0._4_4_ = fVar123;
  local_2a0._0_4_ = fVar123;
  local_2a0._8_4_ = fVar123;
  local_2a0._12_4_ = fVar123;
  local_2a0._16_4_ = fVar123;
  local_2a0._20_4_ = fVar123;
  local_2a0._24_4_ = fVar123;
  local_2a0._28_4_ = fVar123;
  fVar124 = auVar94._0_4_;
  local_220 = fVar124;
  fStack_21c = fVar124;
  fStack_218 = fVar124;
  fStack_214 = fVar124;
  fStack_210 = fVar124;
  fStack_20c = fVar124;
  fStack_208 = fVar124;
  fStack_204 = fVar124;
  fVar180 = auVar160._0_4_;
  auVar12._4_4_ = uStack_85c;
  auVar12._0_4_ = local_860;
  auVar12._8_4_ = uStack_858;
  auVar12._12_4_ = uStack_854;
  auVar12._16_4_ = uStack_850;
  auVar12._20_4_ = uStack_84c;
  auVar12._24_4_ = uStack_848;
  auVar12._28_4_ = uStack_844;
  local_540 = vandps_avx(local_200,auVar12);
  auVar5 = vsqrtss_avx(local_9f0,local_9f0);
  auVar8 = vsqrtss_avx(local_9f0,local_9f0);
  local_8e0 = ZEXT816(0x3f80000000000000);
  auVar265._8_8_ = local_520;
  auVar265._0_8_ = local_520;
  auVar265._16_8_ = local_520;
  auVar265._24_8_ = local_520;
  local_2c0 = fVar180;
  fStack_2bc = fVar180;
  fStack_2b8 = fVar180;
  fStack_2b4 = fVar180;
  fStack_2b0 = fVar180;
  fStack_2ac = fVar180;
  fStack_2a8 = fVar180;
  fStack_2a4 = fVar180;
  uVar81 = 1;
  fStack_4f8 = local_500;
  fStack_4f4 = fStack_4fc;
  fStack_4f0 = local_500;
  fStack_4ec = fStack_4fc;
  fStack_4e8 = local_500;
  fStack_4e4 = fStack_4fc;
  fStack_4d8 = local_4e0;
  fStack_4d4 = fStack_4dc;
  fStack_4d0 = local_4e0;
  fStack_4cc = fStack_4dc;
  fStack_4c8 = local_4e0;
  fStack_4c4 = fStack_4dc;
  auVar114 = local_aa0;
  do {
    auVar99 = vmovshdup_avx(local_8e0);
    local_7e0._0_4_ = local_8e0._0_4_;
    fVar155 = auVar99._0_4_ - local_7e0._0_4_;
    fVar159 = fVar155 * 0.04761905;
    local_7e0._4_4_ = local_7e0._0_4_;
    local_7e0._8_4_ = local_7e0._0_4_;
    local_7e0._12_4_ = local_7e0._0_4_;
    local_7e0._16_4_ = local_7e0._0_4_;
    local_7e0._20_4_ = local_7e0._0_4_;
    local_7e0._24_4_ = local_7e0._0_4_;
    local_7e0._28_4_ = local_7e0._0_4_;
    auVar104._4_4_ = fVar155;
    auVar104._0_4_ = fVar155;
    auVar104._8_4_ = fVar155;
    auVar104._12_4_ = fVar155;
    auVar104._16_4_ = fVar155;
    auVar104._20_4_ = fVar155;
    auVar104._24_4_ = fVar155;
    auVar104._28_4_ = fVar155;
    auStack_7f0 = auVar104._16_16_;
    auVar99 = vfmadd231ps_fma(local_7e0,auVar104,_DAT_02020f20);
    auVar144._8_4_ = 0x3f800000;
    auVar144._0_8_ = &DAT_3f8000003f800000;
    auVar144._12_4_ = 0x3f800000;
    auVar144._16_4_ = 0x3f800000;
    auVar144._20_4_ = 0x3f800000;
    auVar144._24_4_ = 0x3f800000;
    auVar144._28_4_ = 0x3f800000;
    auVar107 = vsubps_avx(auVar144,ZEXT1632(auVar99));
    fVar125 = auVar99._0_4_;
    auVar278._0_4_ = local_2a0._0_4_ * fVar125;
    fVar292 = auVar99._4_4_;
    auVar278._4_4_ = local_2a0._4_4_ * fVar292;
    fVar154 = auVar99._8_4_;
    auVar278._8_4_ = local_2a0._8_4_ * fVar154;
    fVar89 = auVar99._12_4_;
    auVar278._12_4_ = local_2a0._12_4_ * fVar89;
    auVar278._16_4_ = local_2a0._16_4_ * 0.0;
    auVar278._20_4_ = local_2a0._20_4_ * 0.0;
    auVar278._28_36_ = auVar277._28_36_;
    auVar278._24_4_ = local_2a0._24_4_ * 0.0;
    fVar293 = auVar4._0_4_;
    fVar157 = auVar4._4_4_;
    auVar75._4_4_ = fVar157 * fVar292;
    auVar75._0_4_ = fVar293 * fVar125;
    auVar75._8_4_ = fVar293 * fVar154;
    auVar75._12_4_ = fVar157 * fVar89;
    auVar75._16_4_ = fVar293 * 0.0;
    auVar75._20_4_ = fVar157 * 0.0;
    auVar75._24_4_ = fVar293 * 0.0;
    auVar75._28_4_ = auVar114._28_4_;
    fVar293 = auVar6._0_4_;
    auVar277._0_4_ = fVar293 * fVar125;
    fVar156 = auVar6._4_4_;
    auVar277._4_4_ = fVar156 * fVar292;
    auVar277._8_4_ = fVar293 * fVar154;
    auVar277._12_4_ = fVar156 * fVar89;
    auVar277._16_4_ = fVar293 * 0.0;
    auVar277._20_4_ = fVar156 * 0.0;
    auVar277._28_36_ = auVar269._28_36_;
    auVar277._24_4_ = fVar293 * 0.0;
    auVar13._4_4_ = local_280._4_4_ * fVar292;
    auVar13._0_4_ = local_280._0_4_ * fVar125;
    auVar13._8_4_ = local_280._8_4_ * fVar154;
    auVar13._12_4_ = local_280._12_4_ * fVar89;
    auVar13._16_4_ = local_280._16_4_ * 0.0;
    auVar13._20_4_ = local_280._20_4_ * 0.0;
    auVar13._24_4_ = local_280._24_4_ * 0.0;
    auVar13._28_4_ = fVar155;
    auVar99 = vfmadd231ps_fma(auVar278._0_32_,auVar107,auVar103);
    auVar92 = vfmadd231ps_fma(auVar75,auVar107,auVar265);
    auVar126 = vfmadd231ps_fma(auVar277._0_32_,auVar107,auVar238._0_32_);
    auVar181 = vfmadd231ps_fma(auVar13,auVar107,local_620);
    auVar195._4_4_ = fStack_21c;
    auVar195._0_4_ = local_220;
    auVar195._8_4_ = fStack_218;
    auVar195._12_4_ = fStack_214;
    auVar195._16_4_ = fStack_210;
    auVar195._20_4_ = fStack_20c;
    auVar195._24_4_ = fStack_208;
    auVar195._28_4_ = fStack_204;
    auVar76._4_4_ = fStack_21c * fVar292;
    auVar76._0_4_ = local_220 * fVar125;
    auVar76._8_4_ = fStack_218 * fVar154;
    auVar76._12_4_ = fStack_214 * fVar89;
    auVar76._16_4_ = fStack_210 * 0.0;
    auVar76._20_4_ = fStack_20c * 0.0;
    auVar76._24_4_ = fStack_208 * 0.0;
    auVar76._28_4_ = uVar88;
    auVar269._0_4_ = fVar125 * local_4e0;
    auVar269._4_4_ = fVar292 * fStack_4dc;
    auVar269._8_4_ = fVar154 * fStack_4d8;
    auVar269._12_4_ = fVar89 * fStack_4d4;
    auVar269._16_4_ = fStack_4d0 * 0.0;
    auVar269._20_4_ = fStack_4cc * 0.0;
    auVar269._28_36_ = auVar238._28_36_;
    auVar269._24_4_ = fStack_4c8 * 0.0;
    fVar155 = auVar7._0_4_;
    fVar293 = auVar7._4_4_;
    auVar14._4_4_ = fVar293 * fVar292;
    auVar14._0_4_ = fVar155 * fVar125;
    auVar14._8_4_ = fVar155 * fVar154;
    auVar14._12_4_ = fVar293 * fVar89;
    auVar14._16_4_ = fVar155 * 0.0;
    auVar14._20_4_ = fVar293 * 0.0;
    auVar14._24_4_ = fVar155 * 0.0;
    auVar14._28_4_ = auVar265._28_4_;
    auVar198._4_4_ = fVar292 * fStack_4fc;
    auVar198._0_4_ = fVar125 * local_500;
    auVar198._8_4_ = fVar154 * fStack_4f8;
    auVar198._12_4_ = fVar89 * fStack_4f4;
    auVar198._16_4_ = fStack_4f0 * 0.0;
    auVar198._20_4_ = fStack_4ec * 0.0;
    auVar198._24_4_ = fStack_4e8 * 0.0;
    auVar198._28_4_ = local_620._28_4_;
    auVar204 = vfmadd231ps_fma(auVar76,auVar107,local_2a0);
    auVar91 = vfmadd231ps_fma(auVar269._0_32_,auVar107,auVar285);
    auVar133 = vfmadd231ps_fma(auVar14,auVar107,auVar283);
    auVar164 = vfmadd231ps_fma(auVar198,auVar107,local_280);
    auVar166._4_4_ = fStack_2bc * fVar292;
    auVar166._0_4_ = local_2c0 * fVar125;
    auVar166._8_4_ = fStack_2b8 * fVar154;
    auVar166._12_4_ = fStack_2b4 * fVar89;
    auVar166._16_4_ = fStack_2b0 * 0.0;
    auVar166._20_4_ = fStack_2ac * 0.0;
    auVar166._24_4_ = fStack_2a8 * 0.0;
    auVar166._28_4_ = fVar157;
    auVar15._4_4_ = fVar292 * local_1a0._4_4_;
    auVar15._0_4_ = fVar125 * (float)local_1a0;
    auVar15._8_4_ = fVar154 * (float)uStack_198;
    auVar15._12_4_ = fVar89 * uStack_198._4_4_;
    auVar15._16_4_ = (float)uStack_190 * 0.0;
    auVar15._20_4_ = uStack_190._4_4_ * 0.0;
    auVar15._24_4_ = (float)uStack_188 * 0.0;
    auVar15._28_4_ = fVar156;
    auVar77._28_4_ = fVar293;
    auVar77._0_28_ =
         ZEXT1628(CONCAT412(auVar204._12_4_ * fVar89,
                            CONCAT48(auVar204._8_4_ * fVar154,
                                     CONCAT44(auVar204._4_4_ * fVar292,auVar204._0_4_ * fVar125))));
    auVar99 = vfmadd231ps_fma(auVar77,auVar107,ZEXT1632(auVar99));
    auVar92 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar89 * auVar91._12_4_,
                                                 CONCAT48(fVar154 * auVar91._8_4_,
                                                          CONCAT44(fVar292 * auVar91._4_4_,
                                                                   fVar125 * auVar91._0_4_)))),
                              auVar107,ZEXT1632(auVar92));
    auVar126 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar89 * auVar133._12_4_,
                                                  CONCAT48(fVar154 * auVar133._8_4_,
                                                           CONCAT44(fVar292 * auVar133._4_4_,
                                                                    fVar125 * auVar133._0_4_)))),
                               auVar107,ZEXT1632(auVar126));
    auVar181 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar89 * auVar164._12_4_,
                                                  CONCAT48(fVar154 * auVar164._8_4_,
                                                           CONCAT44(fVar292 * auVar164._4_4_,
                                                                    fVar125 * auVar164._0_4_)))),
                               auVar107,ZEXT1632(auVar181));
    auVar199._4_4_ = fVar292 * local_1c0._4_4_;
    auVar199._0_4_ = fVar125 * (float)local_1c0;
    auVar199._8_4_ = fVar154 * (float)uStack_1b8;
    auVar199._12_4_ = fVar89 * uStack_1b8._4_4_;
    auVar199._16_4_ = (float)uStack_1b0 * 0.0;
    auVar199._20_4_ = uStack_1b0._4_4_ * 0.0;
    auVar199._24_4_ = (float)uStack_1a8 * 0.0;
    auVar199._28_4_ = local_2a0._28_4_;
    auVar220 = vfmadd231ps_fma(auVar166,auVar107,auVar195);
    auVar204 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar220._12_4_ * fVar89,
                                                  CONCAT48(auVar220._8_4_ * fVar154,
                                                           CONCAT44(auVar220._4_4_ * fVar292,
                                                                    auVar220._0_4_ * fVar125)))),
                               auVar107,ZEXT1632(auVar204));
    auVar264._0_4_ = fVar125 * (float)local_1e0;
    auVar264._4_4_ = fVar292 * local_1e0._4_4_;
    auVar264._8_4_ = fVar154 * (float)uStack_1d8;
    auVar264._12_4_ = fVar89 * uStack_1d8._4_4_;
    auVar264._16_4_ = (float)uStack_1d0 * 0.0;
    auVar264._20_4_ = uStack_1d0._4_4_ * 0.0;
    auVar264._24_4_ = (float)uStack_1c8 * 0.0;
    auVar264._28_4_ = 0;
    auVar105._4_4_ = fStack_4dc;
    auVar105._0_4_ = local_4e0;
    auVar105._8_4_ = fStack_4d8;
    auVar105._12_4_ = fStack_4d4;
    auVar105._16_4_ = fStack_4d0;
    auVar105._20_4_ = fStack_4cc;
    auVar105._24_4_ = fStack_4c8;
    auVar105._28_4_ = fStack_4c4;
    auVar220 = vfmadd231ps_fma(auVar15,auVar107,auVar105);
    auVar221 = vfmadd231ps_fma(auVar199,auVar107,auVar243);
    auVar18._4_4_ = fStack_4fc;
    auVar18._0_4_ = local_500;
    auVar18._8_4_ = fStack_4f8;
    auVar18._12_4_ = fStack_4f4;
    auVar18._16_4_ = fStack_4f0;
    auVar18._20_4_ = fStack_4ec;
    auVar18._24_4_ = fStack_4e8;
    auVar18._28_4_ = fStack_4e4;
    auVar222 = vfmadd231ps_fma(auVar264,auVar107,auVar18);
    auVar233._28_4_ = fStack_2a4;
    auVar233._0_28_ =
         ZEXT1628(CONCAT412(auVar222._12_4_ * fVar89,
                            CONCAT48(auVar222._8_4_ * fVar154,
                                     CONCAT44(auVar222._4_4_ * fVar292,auVar222._0_4_ * fVar125))));
    auVar91 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar220._12_4_ * fVar89,
                                                 CONCAT48(auVar220._8_4_ * fVar154,
                                                          CONCAT44(auVar220._4_4_ * fVar292,
                                                                   auVar220._0_4_ * fVar125)))),
                              auVar107,ZEXT1632(auVar91));
    auVar133 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar89 * auVar221._12_4_,
                                                  CONCAT48(fVar154 * auVar221._8_4_,
                                                           CONCAT44(fVar292 * auVar221._4_4_,
                                                                    fVar125 * auVar221._0_4_)))),
                               auVar107,ZEXT1632(auVar133));
    auVar164 = vfmadd231ps_fma(auVar233,auVar107,ZEXT1632(auVar164));
    auVar16._28_4_ = fStack_204;
    auVar16._0_28_ =
         ZEXT1628(CONCAT412(auVar91._12_4_ * fVar89,
                            CONCAT48(auVar91._8_4_ * fVar154,
                                     CONCAT44(auVar91._4_4_ * fVar292,auVar91._0_4_ * fVar125))));
    auVar17._28_4_ = local_280._28_4_;
    auVar17._0_28_ =
         ZEXT1628(CONCAT412(fVar89 * auVar133._12_4_,
                            CONCAT48(fVar154 * auVar133._8_4_,
                                     CONCAT44(fVar292 * auVar133._4_4_,fVar125 * auVar133._0_4_))));
    auVar220 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar204._12_4_ * fVar89,
                                                  CONCAT48(auVar204._8_4_ * fVar154,
                                                           CONCAT44(auVar204._4_4_ * fVar292,
                                                                    auVar204._0_4_ * fVar125)))),
                               auVar107,ZEXT1632(auVar99));
    auVar221 = vfmadd231ps_fma(auVar16,auVar107,ZEXT1632(auVar92));
    auVar105 = ZEXT1632(auVar221);
    auVar221 = vfmadd231ps_fma(auVar17,auVar107,ZEXT1632(auVar126));
    auVar222 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar164._12_4_ * fVar89,
                                                  CONCAT48(auVar164._8_4_ * fVar154,
                                                           CONCAT44(auVar164._4_4_ * fVar292,
                                                                    auVar164._0_4_ * fVar125)))),
                               ZEXT1632(auVar181),auVar107);
    auVar265 = vsubps_avx(ZEXT1632(auVar204),ZEXT1632(auVar99));
    auVar114 = vsubps_avx(ZEXT1632(auVar91),ZEXT1632(auVar92));
    auVar107 = vsubps_avx(ZEXT1632(auVar133),ZEXT1632(auVar126));
    auVar12 = vsubps_avx(ZEXT1632(auVar164),ZEXT1632(auVar181));
    auVar244._0_4_ = fVar159 * auVar265._0_4_ * 3.0;
    auVar244._4_4_ = fVar159 * auVar265._4_4_ * 3.0;
    auVar244._8_4_ = fVar159 * auVar265._8_4_ * 3.0;
    auVar244._12_4_ = fVar159 * auVar265._12_4_ * 3.0;
    auVar244._16_4_ = fVar159 * auVar265._16_4_ * 3.0;
    auVar244._20_4_ = fVar159 * auVar265._20_4_ * 3.0;
    auVar244._24_4_ = fVar159 * auVar265._24_4_ * 3.0;
    auVar244._28_4_ = 0;
    local_780._0_4_ = fVar159 * auVar114._0_4_ * 3.0;
    local_780._4_4_ = fVar159 * auVar114._4_4_ * 3.0;
    local_780._8_4_ = fVar159 * auVar114._8_4_ * 3.0;
    local_780._12_4_ = fVar159 * auVar114._12_4_ * 3.0;
    local_780._16_4_ = fVar159 * auVar114._16_4_ * 3.0;
    local_780._20_4_ = fVar159 * auVar114._20_4_ * 3.0;
    local_780._24_4_ = fVar159 * auVar114._24_4_ * 3.0;
    local_780._28_4_ = 0;
    local_a80._0_4_ = fVar159 * auVar107._0_4_ * 3.0;
    local_a80._4_4_ = fVar159 * auVar107._4_4_ * 3.0;
    local_a80._8_4_ = fVar159 * auVar107._8_4_ * 3.0;
    local_a80._12_4_ = fVar159 * auVar107._12_4_ * 3.0;
    local_a80._16_4_ = fVar159 * auVar107._16_4_ * 3.0;
    local_a80._20_4_ = fVar159 * auVar107._20_4_ * 3.0;
    local_a80._24_4_ = fVar159 * auVar107._24_4_ * 3.0;
    local_a80._28_4_ = 0;
    fVar125 = fVar159 * auVar12._0_4_ * 3.0;
    fVar154 = fVar159 * auVar12._4_4_ * 3.0;
    auVar20._4_4_ = fVar154;
    auVar20._0_4_ = fVar125;
    fVar155 = fVar159 * auVar12._8_4_ * 3.0;
    auVar20._8_4_ = fVar155;
    fVar156 = fVar159 * auVar12._12_4_ * 3.0;
    auVar20._12_4_ = fVar156;
    fVar157 = fVar159 * auVar12._16_4_ * 3.0;
    auVar20._16_4_ = fVar157;
    fVar158 = fVar159 * auVar12._20_4_ * 3.0;
    auVar20._20_4_ = fVar158;
    fVar159 = fVar159 * auVar12._24_4_ * 3.0;
    auVar20._24_4_ = fVar159;
    auVar20._28_4_ = auVar265._28_4_;
    auVar195 = ZEXT1632(auVar220);
    auVar198 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar220));
    auVar18 = vpermps_avx2(_DAT_0205d4a0,auVar105);
    _local_940 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar221));
    auVar13 = vsubps_avx(auVar198,auVar195);
    auVar14 = vsubps_avx(_local_940,ZEXT1632(auVar221));
    fVar176 = auVar14._0_4_;
    fVar177 = auVar14._4_4_;
    auVar19._4_4_ = fVar177 * auVar244._4_4_;
    auVar19._0_4_ = fVar176 * auVar244._0_4_;
    fVar178 = auVar14._8_4_;
    auVar19._8_4_ = fVar178 * auVar244._8_4_;
    fVar179 = auVar14._12_4_;
    auVar19._12_4_ = fVar179 * auVar244._12_4_;
    fVar218 = auVar14._16_4_;
    auVar19._16_4_ = fVar218 * auVar244._16_4_;
    fVar219 = auVar14._20_4_;
    auVar19._20_4_ = fVar219 * auVar244._20_4_;
    fVar239 = auVar14._24_4_;
    auVar19._24_4_ = fVar239 * auVar244._24_4_;
    auVar19._28_4_ = local_940._28_4_;
    auVar99 = vfmsub231ps_fma(auVar19,local_a80,auVar13);
    auVar166 = vsubps_avx(auVar18,auVar105);
    fVar273 = auVar13._0_4_;
    fVar274 = auVar13._4_4_;
    auVar21._4_4_ = fVar274 * local_780._4_4_;
    auVar21._0_4_ = fVar273 * local_780._0_4_;
    fVar275 = auVar13._8_4_;
    auVar21._8_4_ = fVar275 * local_780._8_4_;
    fVar279 = auVar13._12_4_;
    auVar21._12_4_ = fVar279 * local_780._12_4_;
    fVar280 = auVar13._16_4_;
    auVar21._16_4_ = fVar280 * local_780._16_4_;
    fVar281 = auVar13._20_4_;
    auVar21._20_4_ = fVar281 * local_780._20_4_;
    fVar282 = auVar13._24_4_;
    auVar21._24_4_ = fVar282 * local_780._24_4_;
    auVar21._28_4_ = auVar198._28_4_;
    auVar92 = vfmsub231ps_fma(auVar21,auVar244,auVar166);
    auVar99 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar92._12_4_ * auVar92._12_4_,
                                                 CONCAT48(auVar92._8_4_ * auVar92._8_4_,
                                                          CONCAT44(auVar92._4_4_ * auVar92._4_4_,
                                                                   auVar92._0_4_ * auVar92._0_4_))))
                              ,ZEXT1632(auVar99),ZEXT1632(auVar99));
    fVar203 = auVar166._0_4_;
    fVar214 = auVar166._4_4_;
    auVar108._4_4_ = fVar214 * local_a80._4_4_;
    auVar108._0_4_ = fVar203 * local_a80._0_4_;
    fVar215 = auVar166._8_4_;
    auVar108._8_4_ = fVar215 * local_a80._8_4_;
    fVar216 = auVar166._12_4_;
    auVar108._12_4_ = fVar216 * local_a80._12_4_;
    fVar217 = auVar166._16_4_;
    auVar108._16_4_ = fVar217 * local_a80._16_4_;
    fVar248 = auVar166._20_4_;
    auVar108._20_4_ = fVar248 * local_a80._20_4_;
    fVar254 = auVar166._24_4_;
    auVar108._24_4_ = fVar254 * local_a80._24_4_;
    auVar108._28_4_ = auVar18._28_4_;
    auVar126 = vfmsub231ps_fma(auVar108,local_780,auVar14);
    auVar196._0_4_ = fVar176 * fVar176;
    auVar196._4_4_ = fVar177 * fVar177;
    auVar196._8_4_ = fVar178 * fVar178;
    auVar196._12_4_ = fVar179 * fVar179;
    auVar196._16_4_ = fVar218 * fVar218;
    auVar196._20_4_ = fVar219 * fVar219;
    auVar196._24_4_ = fVar239 * fVar239;
    auVar196._28_4_ = 0;
    auVar92 = vfmadd231ps_fma(auVar196,auVar166,auVar166);
    auVar92 = vfmadd231ps_fma(ZEXT1632(auVar92),auVar13,auVar13);
    auVar114 = vrcpps_avx(ZEXT1632(auVar92));
    auVar126 = vfmadd231ps_fma(ZEXT1632(auVar99),ZEXT1632(auVar126),ZEXT1632(auVar126));
    auVar268._8_4_ = 0x3f800000;
    auVar268._0_8_ = &DAT_3f8000003f800000;
    auVar268._12_4_ = 0x3f800000;
    auVar268._16_4_ = 0x3f800000;
    auVar268._20_4_ = 0x3f800000;
    auVar268._24_4_ = 0x3f800000;
    auVar268._28_4_ = 0x3f800000;
    auVar99 = vfnmadd213ps_fma(auVar114,ZEXT1632(auVar92),auVar268);
    auVar99 = vfmadd132ps_fma(ZEXT1632(auVar99),auVar114,auVar114);
    auVar19 = vpermps_avx2(_DAT_0205d4a0,auVar244);
    local_a60 = vpermps_avx2(_DAT_0205d4a0,local_a80);
    auVar295._4_4_ = fVar177 * auVar19._4_4_;
    auVar295._0_4_ = fVar176 * auVar19._0_4_;
    auVar295._8_4_ = fVar178 * auVar19._8_4_;
    auVar295._12_4_ = fVar179 * auVar19._12_4_;
    auVar295._16_4_ = fVar218 * auVar19._16_4_;
    auVar295._20_4_ = fVar219 * auVar19._20_4_;
    auVar295._24_4_ = fVar239 * auVar19._24_4_;
    auVar295._28_4_ = auVar114._28_4_;
    auVar181 = vfmsub231ps_fma(auVar295,local_a60,auVar13);
    local_960 = vpermps_avx2(_DAT_0205d4a0,local_780);
    auVar10._4_4_ = fVar274 * local_960._4_4_;
    auVar10._0_4_ = fVar273 * local_960._0_4_;
    auVar10._8_4_ = fVar275 * local_960._8_4_;
    auVar10._12_4_ = fVar279 * local_960._12_4_;
    auVar10._16_4_ = fVar280 * local_960._16_4_;
    auVar10._20_4_ = fVar281 * local_960._20_4_;
    auVar10._24_4_ = fVar282 * local_960._24_4_;
    auVar10._28_4_ = 0;
    auVar204 = vfmsub231ps_fma(auVar10,auVar19,auVar166);
    auVar181 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar204._12_4_ * auVar204._12_4_,
                                                  CONCAT48(auVar204._8_4_ * auVar204._8_4_,
                                                           CONCAT44(auVar204._4_4_ * auVar204._4_4_,
                                                                    auVar204._0_4_ * auVar204._0_4_)
                                                          ))),ZEXT1632(auVar181),ZEXT1632(auVar181))
    ;
    fVar292 = local_a60._0_4_;
    auVar230._0_4_ = fVar203 * fVar292;
    fVar89 = local_a60._4_4_;
    auVar230._4_4_ = fVar214 * fVar89;
    fVar293 = local_a60._8_4_;
    auVar230._8_4_ = fVar215 * fVar293;
    fVar294 = local_a60._12_4_;
    auVar230._12_4_ = fVar216 * fVar294;
    fVar297 = local_a60._16_4_;
    auVar230._16_4_ = fVar217 * fVar297;
    fVar298 = local_a60._20_4_;
    auVar230._20_4_ = fVar248 * fVar298;
    fVar299 = local_a60._24_4_;
    auVar230._24_4_ = fVar254 * fVar299;
    auVar230._28_4_ = 0;
    auVar204 = vfmsub231ps_fma(auVar230,local_960,auVar14);
    auVar181 = vfmadd231ps_fma(ZEXT1632(auVar181),ZEXT1632(auVar204),ZEXT1632(auVar204));
    auVar114 = vmaxps_avx(ZEXT1632(CONCAT412(auVar126._12_4_ * auVar99._12_4_,
                                             CONCAT48(auVar126._8_4_ * auVar99._8_4_,
                                                      CONCAT44(auVar126._4_4_ * auVar99._4_4_,
                                                               auVar126._0_4_ * auVar99._0_4_)))),
                          ZEXT1632(CONCAT412(auVar181._12_4_ * auVar99._12_4_,
                                             CONCAT48(auVar181._8_4_ * auVar99._8_4_,
                                                      CONCAT44(auVar181._4_4_ * auVar99._4_4_,
                                                               auVar181._0_4_ * auVar99._0_4_)))));
    auVar210._0_4_ = auVar222._0_4_ + fVar125;
    auVar210._4_4_ = auVar222._4_4_ + fVar154;
    auVar210._8_4_ = auVar222._8_4_ + fVar155;
    auVar210._12_4_ = auVar222._12_4_ + fVar156;
    auVar210._16_4_ = fVar157 + 0.0;
    auVar210._20_4_ = fVar158 + 0.0;
    auVar210._24_4_ = fVar159 + 0.0;
    auVar210._28_4_ = auVar265._28_4_ + 0.0;
    local_820 = ZEXT1632(auVar222);
    auVar265 = vsubps_avx(local_820,auVar20);
    auVar20 = vpermps_avx2(_DAT_0205d4a0,auVar265);
    auVar21 = vpermps_avx2(_DAT_0205d4a0,local_820);
    auVar265 = vmaxps_avx(local_820,auVar210);
    auVar107 = vmaxps_avx(auVar20,auVar21);
    auVar12 = vrsqrtps_avx(ZEXT1632(auVar92));
    auVar265 = vmaxps_avx(auVar265,auVar107);
    fVar125 = auVar12._0_4_;
    fVar154 = auVar12._4_4_;
    fVar159 = auVar12._8_4_;
    fVar155 = auVar12._12_4_;
    fVar156 = auVar12._16_4_;
    fVar157 = auVar12._20_4_;
    fVar158 = auVar12._24_4_;
    auVar11._4_4_ = fVar154 * fVar154 * fVar154 * auVar92._4_4_ * -0.5;
    auVar11._0_4_ = fVar125 * fVar125 * fVar125 * auVar92._0_4_ * -0.5;
    auVar11._8_4_ = fVar159 * fVar159 * fVar159 * auVar92._8_4_ * -0.5;
    auVar11._12_4_ = fVar155 * fVar155 * fVar155 * auVar92._12_4_ * -0.5;
    auVar11._16_4_ = fVar156 * fVar156 * fVar156 * -0.0;
    auVar11._20_4_ = fVar157 * fVar157 * fVar157 * -0.0;
    auVar11._24_4_ = fVar158 * fVar158 * fVar158 * -0.0;
    auVar11._28_4_ = auVar19._28_4_;
    auVar106._8_4_ = 0x3fc00000;
    auVar106._0_8_ = 0x3fc000003fc00000;
    auVar106._12_4_ = 0x3fc00000;
    auVar106._16_4_ = 0x3fc00000;
    auVar106._20_4_ = 0x3fc00000;
    auVar106._24_4_ = 0x3fc00000;
    auVar106._28_4_ = 0x3fc00000;
    auVar99 = vfmadd231ps_fma(auVar11,auVar106,auVar12);
    auVar269 = ZEXT1664(auVar99);
    fVar154 = auVar99._0_4_;
    fVar159 = auVar99._4_4_;
    auVar22._4_4_ = fVar214 * fVar159;
    auVar22._0_4_ = fVar203 * fVar154;
    fVar156 = auVar99._8_4_;
    auVar22._8_4_ = fVar215 * fVar156;
    fVar158 = auVar99._12_4_;
    auVar22._12_4_ = fVar216 * fVar158;
    auVar22._16_4_ = fVar217 * 0.0;
    auVar22._20_4_ = fVar248 * 0.0;
    auVar22._24_4_ = fVar254 * 0.0;
    auVar22._28_4_ = 0;
    fVar248 = local_aa0._0_4_;
    fVar254 = local_aa0._4_4_;
    auVar23._4_4_ = fVar254 * fVar177 * fVar159;
    auVar23._0_4_ = fVar248 * fVar176 * fVar154;
    fVar255 = local_aa0._8_4_;
    auVar23._8_4_ = fVar255 * fVar178 * fVar156;
    fVar256 = local_aa0._12_4_;
    auVar23._12_4_ = fVar256 * fVar179 * fVar158;
    fVar257 = local_aa0._16_4_;
    auVar23._16_4_ = fVar257 * fVar218 * 0.0;
    fVar258 = local_aa0._20_4_;
    auVar23._20_4_ = fVar258 * fVar219 * 0.0;
    fVar259 = local_aa0._24_4_;
    auVar23._24_4_ = fVar259 * fVar239 * 0.0;
    auVar23._28_4_ = auVar14._28_4_;
    auVar92 = vfmadd231ps_fma(auVar23,auVar22,_local_9a0);
    auVar295 = ZEXT1632(auVar221);
    auVar107 = ZEXT1232(ZEXT812(0)) << 0x20;
    auVar15 = vsubps_avx(auVar107,auVar295);
    fVar203 = auVar15._0_4_;
    fVar214 = auVar15._4_4_;
    auVar24._4_4_ = fVar214 * fVar177 * fVar159;
    auVar24._0_4_ = fVar203 * fVar176 * fVar154;
    fVar215 = auVar15._8_4_;
    auVar24._8_4_ = fVar215 * fVar178 * fVar156;
    fVar216 = auVar15._12_4_;
    auVar24._12_4_ = fVar216 * fVar179 * fVar158;
    fVar217 = auVar15._16_4_;
    auVar24._16_4_ = fVar217 * fVar218 * 0.0;
    fVar218 = auVar15._20_4_;
    auVar24._20_4_ = fVar218 * fVar219 * 0.0;
    fVar219 = auVar15._24_4_;
    auVar24._24_4_ = fVar219 * fVar239 * 0.0;
    auVar24._28_4_ = auVar166._28_4_;
    auVar199 = vsubps_avx(auVar107,auVar105);
    auVar126 = vfmadd231ps_fma(auVar24,auVar199,auVar22);
    auVar25._4_4_ = fVar274 * fVar159;
    auVar25._0_4_ = fVar273 * fVar154;
    auVar25._8_4_ = fVar275 * fVar156;
    auVar25._12_4_ = fVar279 * fVar158;
    auVar25._16_4_ = fVar280 * 0.0;
    auVar25._20_4_ = fVar281 * 0.0;
    auVar25._24_4_ = fVar282 * 0.0;
    auVar25._28_4_ = auVar12._28_4_;
    auVar92 = vfmadd231ps_fma(ZEXT1632(auVar92),auVar25,auVar229);
    auVar108 = ZEXT1232(ZEXT812(0)) << 0x20;
    auVar233 = vsubps_avx(auVar108,auVar195);
    auVar126 = vfmadd231ps_fma(ZEXT1632(auVar126),auVar233,auVar25);
    auVar26._4_4_ = fVar254 * fVar214;
    auVar26._0_4_ = fVar248 * fVar203;
    auVar26._8_4_ = fVar255 * fVar215;
    auVar26._12_4_ = fVar256 * fVar216;
    auVar26._16_4_ = fVar257 * fVar217;
    auVar26._20_4_ = fVar258 * fVar218;
    auVar26._24_4_ = fVar259 * fVar219;
    auVar26._28_4_ = auVar12._28_4_;
    auVar181 = vfmadd231ps_fma(auVar26,_local_9a0,auVar199);
    auVar181 = vfmadd231ps_fma(ZEXT1632(auVar181),auVar229,auVar233);
    fVar125 = auVar126._0_4_;
    fVar239 = auVar92._0_4_;
    fVar155 = auVar126._4_4_;
    fVar273 = auVar92._4_4_;
    fVar157 = auVar126._8_4_;
    fVar274 = auVar92._8_4_;
    fVar176 = auVar126._12_4_;
    fVar275 = auVar92._12_4_;
    auVar27._28_4_ = fVar87;
    auVar27._0_28_ =
         ZEXT1628(CONCAT412(fVar275 * fVar176,
                            CONCAT48(fVar274 * fVar157,CONCAT44(fVar273 * fVar155,fVar239 * fVar125)
                                    )));
    auVar12 = vsubps_avx(ZEXT1632(auVar181),auVar27);
    auVar28._4_4_ = fVar214 * fVar214;
    auVar28._0_4_ = fVar203 * fVar203;
    auVar28._8_4_ = fVar215 * fVar215;
    auVar28._12_4_ = fVar216 * fVar216;
    auVar28._16_4_ = fVar217 * fVar217;
    auVar28._20_4_ = fVar218 * fVar218;
    auVar28._24_4_ = fVar219 * fVar219;
    auVar28._28_4_ = fVar87;
    auVar181 = vfmadd231ps_fma(auVar28,auVar199,auVar199);
    auVar181 = vfmadd231ps_fma(ZEXT1632(auVar181),auVar233,auVar233);
    auVar29._28_4_ = auVar13._28_4_;
    auVar29._0_28_ =
         ZEXT1628(CONCAT412(fVar176 * fVar176,
                            CONCAT48(fVar157 * fVar157,CONCAT44(fVar155 * fVar155,fVar125 * fVar125)
                                    )));
    auVar16 = vsubps_avx(ZEXT1632(auVar181),auVar29);
    auVar107 = vsqrtps_avx(auVar114);
    fVar125 = (auVar265._0_4_ + auVar107._0_4_) * 1.0000002;
    fVar155 = (auVar265._4_4_ + auVar107._4_4_) * 1.0000002;
    fVar157 = (auVar265._8_4_ + auVar107._8_4_) * 1.0000002;
    fVar176 = (auVar265._12_4_ + auVar107._12_4_) * 1.0000002;
    fVar177 = (auVar265._16_4_ + auVar107._16_4_) * 1.0000002;
    fVar178 = (auVar265._20_4_ + auVar107._20_4_) * 1.0000002;
    fVar179 = (auVar265._24_4_ + auVar107._24_4_) * 1.0000002;
    auVar30._4_4_ = fVar155 * fVar155;
    auVar30._0_4_ = fVar125 * fVar125;
    auVar30._8_4_ = fVar157 * fVar157;
    auVar30._12_4_ = fVar176 * fVar176;
    auVar30._16_4_ = fVar177 * fVar177;
    auVar30._20_4_ = fVar178 * fVar178;
    auVar30._24_4_ = fVar179 * fVar179;
    auVar30._28_4_ = auVar265._28_4_ + auVar107._28_4_;
    local_240._0_4_ = auVar12._0_4_ + auVar12._0_4_;
    local_240._4_4_ = auVar12._4_4_ + auVar12._4_4_;
    local_240._8_4_ = auVar12._8_4_ + auVar12._8_4_;
    local_240._12_4_ = auVar12._12_4_ + auVar12._12_4_;
    local_240._16_4_ = auVar12._16_4_ + auVar12._16_4_;
    local_240._20_4_ = auVar12._20_4_ + auVar12._20_4_;
    local_240._24_4_ = auVar12._24_4_ + auVar12._24_4_;
    local_240._28_4_ = auVar12._28_4_ + auVar12._28_4_;
    auVar265 = vsubps_avx(auVar16,auVar30);
    local_7a0 = ZEXT1632(auVar92);
    local_300 = ZEXT1632(CONCAT412(fVar275 * fVar275,
                                   CONCAT48(fVar274 * fVar274,
                                            CONCAT44(fVar273 * fVar273,fVar239 * fVar239))));
    auVar12 = vsubps_avx(local_200,local_300);
    auVar31._4_4_ = local_240._4_4_ * local_240._4_4_;
    auVar31._0_4_ = local_240._0_4_ * local_240._0_4_;
    auVar31._8_4_ = local_240._8_4_ * local_240._8_4_;
    auVar31._12_4_ = local_240._12_4_ * local_240._12_4_;
    auVar31._16_4_ = local_240._16_4_ * local_240._16_4_;
    auVar31._20_4_ = local_240._20_4_ * local_240._20_4_;
    auVar31._24_4_ = local_240._24_4_ * local_240._24_4_;
    auVar31._28_4_ = 0x3f800002;
    fVar155 = auVar12._0_4_;
    fVar157 = auVar12._4_4_;
    fVar176 = auVar12._8_4_;
    fVar177 = auVar12._12_4_;
    fVar178 = auVar12._16_4_;
    fVar179 = auVar12._20_4_;
    fVar239 = auVar12._24_4_;
    auVar32._4_4_ = auVar265._4_4_ * fVar157 * 4.0;
    auVar32._0_4_ = auVar265._0_4_ * fVar155 * 4.0;
    auVar32._8_4_ = auVar265._8_4_ * fVar176 * 4.0;
    auVar32._12_4_ = auVar265._12_4_ * fVar177 * 4.0;
    auVar32._16_4_ = auVar265._16_4_ * fVar178 * 4.0;
    auVar32._20_4_ = auVar265._20_4_ * fVar179 * 4.0;
    auVar32._24_4_ = auVar265._24_4_ * fVar239 * 4.0;
    auVar32._28_4_ = 0x40800000;
    auVar17 = vsubps_avx(auVar31,auVar32);
    auVar114 = vcmpps_avx(auVar17,auVar108,5);
    local_7c0 = ZEXT1632(auVar126);
    fVar125 = auVar12._28_4_;
    if ((((((((auVar114 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar114 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar114 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar114 >> 0x7f,0) == '\0') &&
          (auVar114 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar114 >> 0xbf,0) == '\0') &&
        (auVar114 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar114[0x1f])
    {
      local_b40._8_4_ = 0x7f800000;
      local_b40._0_8_ = 0x7f8000007f800000;
      local_b40._12_4_ = 0x7f800000;
      local_b40._16_4_ = 0x7f800000;
      local_b40._20_4_ = 0x7f800000;
      local_b40._24_4_ = 0x7f800000;
      local_b40._28_4_ = 0x7f800000;
      auVar231._8_4_ = 0xff800000;
      auVar231._0_8_ = 0xff800000ff800000;
      auVar231._12_4_ = 0xff800000;
      auVar231._16_4_ = 0xff800000;
      auVar231._20_4_ = 0xff800000;
      auVar231._24_4_ = 0xff800000;
      auVar231._28_4_ = 0xff800000;
    }
    else {
      auVar11 = vsqrtps_avx(auVar17);
      auVar251._0_4_ = fVar155 + fVar155;
      auVar251._4_4_ = fVar157 + fVar157;
      auVar251._8_4_ = fVar176 + fVar176;
      auVar251._12_4_ = fVar177 + fVar177;
      auVar251._16_4_ = fVar178 + fVar178;
      auVar251._20_4_ = fVar179 + fVar179;
      auVar251._24_4_ = fVar239 + fVar239;
      auVar251._28_4_ = fVar125 + fVar125;
      auVar10 = vrcpps_avx(auVar251);
      auVar108 = vcmpps_avx(auVar17,ZEXT832(0) << 0x20,5);
      auVar232._8_4_ = 0x3f800000;
      auVar232._0_8_ = &DAT_3f8000003f800000;
      auVar232._12_4_ = 0x3f800000;
      auVar232._16_4_ = 0x3f800000;
      auVar232._20_4_ = 0x3f800000;
      auVar232._24_4_ = 0x3f800000;
      auVar232._28_4_ = 0x3f800000;
      auVar92 = vfnmadd213ps_fma(auVar251,auVar10,auVar232);
      auVar92 = vfmadd132ps_fma(ZEXT1632(auVar92),auVar10,auVar10);
      uVar60 = CONCAT44(local_240._4_4_,local_240._0_4_);
      auVar109._0_8_ = uVar60 ^ 0x8000000080000000;
      auVar109._8_4_ = -local_240._8_4_;
      auVar109._12_4_ = -local_240._12_4_;
      auVar109._16_4_ = -local_240._16_4_;
      auVar109._20_4_ = -local_240._20_4_;
      auVar109._24_4_ = -local_240._24_4_;
      auVar109._28_4_ = -local_240._28_4_;
      auVar17 = vsubps_avx(auVar109,auVar11);
      auVar33._4_4_ = auVar17._4_4_ * auVar92._4_4_;
      auVar33._0_4_ = auVar17._0_4_ * auVar92._0_4_;
      auVar33._8_4_ = auVar17._8_4_ * auVar92._8_4_;
      auVar33._12_4_ = auVar17._12_4_ * auVar92._12_4_;
      auVar33._16_4_ = auVar17._16_4_ * 0.0;
      auVar33._20_4_ = auVar17._20_4_ * 0.0;
      auVar33._24_4_ = auVar17._24_4_ * 0.0;
      auVar33._28_4_ = auVar17._28_4_;
      auVar17 = vsubps_avx(auVar11,local_240);
      auVar34._4_4_ = auVar17._4_4_ * auVar92._4_4_;
      auVar34._0_4_ = auVar17._0_4_ * auVar92._0_4_;
      auVar34._8_4_ = auVar17._8_4_ * auVar92._8_4_;
      auVar34._12_4_ = auVar17._12_4_ * auVar92._12_4_;
      auVar34._16_4_ = auVar17._16_4_ * 0.0;
      auVar34._20_4_ = auVar17._20_4_ * 0.0;
      auVar34._24_4_ = auVar17._24_4_ * 0.0;
      auVar34._28_4_ = auVar17._28_4_;
      auVar92 = vfmadd213ps_fma(local_7a0,auVar33,local_7c0);
      local_5e0 = ZEXT1632(CONCAT412(fVar158 * auVar92._12_4_,
                                     CONCAT48(fVar156 * auVar92._8_4_,
                                              CONCAT44(fVar159 * auVar92._4_4_,
                                                       fVar154 * auVar92._0_4_))));
      auVar92 = vfmadd213ps_fma(local_7a0,auVar34,local_7c0);
      local_600 = ZEXT1632(CONCAT412(fVar158 * auVar92._12_4_,
                                     CONCAT48(fVar156 * auVar92._8_4_,
                                              CONCAT44(fVar159 * auVar92._4_4_,
                                                       fVar154 * auVar92._0_4_))));
      auVar245._8_4_ = 0x7f800000;
      auVar245._0_8_ = 0x7f8000007f800000;
      auVar245._12_4_ = 0x7f800000;
      auVar245._16_4_ = 0x7f800000;
      auVar245._20_4_ = 0x7f800000;
      auVar245._24_4_ = 0x7f800000;
      auVar245._28_4_ = 0x7f800000;
      local_b40 = vblendvps_avx(auVar245,auVar33,auVar108);
      auVar69._4_4_ = uStack_85c;
      auVar69._0_4_ = local_860;
      auVar69._8_4_ = uStack_858;
      auVar69._12_4_ = uStack_854;
      auVar69._16_4_ = uStack_850;
      auVar69._20_4_ = uStack_84c;
      auVar69._24_4_ = uStack_848;
      auVar69._28_4_ = uStack_844;
      auVar17 = vandps_avx(local_300,auVar69);
      auVar17 = vmaxps_avx(local_540,auVar17);
      auVar35._4_4_ = auVar17._4_4_ * 1.9073486e-06;
      auVar35._0_4_ = auVar17._0_4_ * 1.9073486e-06;
      auVar35._8_4_ = auVar17._8_4_ * 1.9073486e-06;
      auVar35._12_4_ = auVar17._12_4_ * 1.9073486e-06;
      auVar35._16_4_ = auVar17._16_4_ * 1.9073486e-06;
      auVar35._20_4_ = auVar17._20_4_ * 1.9073486e-06;
      auVar35._24_4_ = auVar17._24_4_ * 1.9073486e-06;
      auVar35._28_4_ = auVar17._28_4_;
      auVar17 = vandps_avx(auVar12,auVar69);
      auVar17 = vcmpps_avx(auVar17,auVar35,1);
      auVar110._8_4_ = 0xff800000;
      auVar110._0_8_ = 0xff800000ff800000;
      auVar110._12_4_ = 0xff800000;
      auVar110._16_4_ = 0xff800000;
      auVar110._20_4_ = 0xff800000;
      auVar110._24_4_ = 0xff800000;
      auVar110._28_4_ = 0xff800000;
      auVar231 = vblendvps_avx(auVar110,auVar34,auVar108);
      auVar10 = auVar108 & auVar17;
      if ((((((((auVar10 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar10 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar10 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar10 >> 0x7f,0) != '\0') ||
            (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar10 >> 0xbf,0) != '\0') ||
          (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar10[0x1f] < '\0') {
        auVar114 = vandps_avx(auVar108,auVar17);
        auVar17 = vcmpps_avx(auVar265,ZEXT832(0) << 0x20,2);
        auVar272._8_4_ = 0xff800000;
        auVar272._0_8_ = 0xff800000ff800000;
        auVar272._12_4_ = 0xff800000;
        auVar272._16_4_ = 0xff800000;
        auVar272._20_4_ = 0xff800000;
        auVar272._24_4_ = 0xff800000;
        auVar272._28_4_ = 0xff800000;
        auVar296._8_4_ = 0x7f800000;
        auVar296._0_8_ = 0x7f8000007f800000;
        auVar296._12_4_ = 0x7f800000;
        auVar296._16_4_ = 0x7f800000;
        auVar296._20_4_ = 0x7f800000;
        auVar296._24_4_ = 0x7f800000;
        auVar296._28_4_ = 0x7f800000;
        auVar265 = vblendvps_avx(auVar296,auVar272,auVar17);
        auVar92 = vpackssdw_avx(auVar114._0_16_,auVar114._16_16_);
        auVar10 = vpmovsxwd_avx2(auVar92);
        local_b40 = vblendvps_avx(local_b40,auVar265,auVar10);
        auVar265 = vblendvps_avx(auVar272,auVar296,auVar17);
        auVar231 = vblendvps_avx(auVar231,auVar265,auVar10);
        auVar119._0_8_ = auVar114._0_8_ ^ 0xffffffffffffffff;
        auVar119._8_4_ = auVar114._8_4_ ^ 0xffffffff;
        auVar119._12_4_ = auVar114._12_4_ ^ 0xffffffff;
        auVar119._16_4_ = auVar114._16_4_ ^ 0xffffffff;
        auVar119._20_4_ = auVar114._20_4_ ^ 0xffffffff;
        auVar119._24_4_ = auVar114._24_4_ ^ 0xffffffff;
        auVar119._28_4_ = auVar114._28_4_ ^ 0xffffffff;
        auVar114 = vorps_avx(auVar17,auVar119);
        auVar114 = vandps_avx(auVar108,auVar114);
      }
    }
    auVar265 = local_260 & auVar114;
    local_760 = uVar81;
    if ((((((((auVar265 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar265 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar265 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar265 >> 0x7f,0) == '\0') &&
          (auVar265 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar265 >> 0xbf,0) == '\0') &&
        (auVar265 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar265[0x1f])
    {
      auVar238 = ZEXT3264(local_9c0);
    }
    else {
      local_320 = ZEXT1632(auVar99);
      fVar273 = *(float *)(ray + k * 4 + 0x100) - (float)local_8f0._0_4_;
      auVar111._4_4_ = fVar273;
      auVar111._0_4_ = fVar273;
      auVar111._8_4_ = fVar273;
      auVar111._12_4_ = fVar273;
      auVar111._16_4_ = fVar273;
      auVar111._20_4_ = fVar273;
      auVar111._24_4_ = fVar273;
      auVar111._28_4_ = fVar273;
      auVar17 = vminps_avx(auVar111,auVar231);
      auVar36._4_4_ = fVar214 * local_a80._4_4_;
      auVar36._0_4_ = fVar203 * local_a80._0_4_;
      auVar36._8_4_ = fVar215 * local_a80._8_4_;
      auVar36._12_4_ = fVar216 * local_a80._12_4_;
      auVar36._16_4_ = fVar217 * local_a80._16_4_;
      auVar36._20_4_ = fVar218 * local_a80._20_4_;
      auVar36._24_4_ = fVar219 * local_a80._24_4_;
      auVar36._28_4_ = auVar15._28_4_;
      auVar99 = vfmadd213ps_fma(auVar199,local_780,auVar36);
      auVar92 = vfmadd213ps_fma(auVar233,auVar244,ZEXT1632(auVar99));
      auVar37._4_4_ = fVar254 * local_a80._4_4_;
      auVar37._0_4_ = fVar248 * local_a80._0_4_;
      auVar37._8_4_ = fVar255 * local_a80._8_4_;
      auVar37._12_4_ = fVar256 * local_a80._12_4_;
      auVar37._16_4_ = fVar257 * local_a80._16_4_;
      auVar37._20_4_ = fVar258 * local_a80._20_4_;
      auVar37._24_4_ = fVar259 * local_a80._24_4_;
      auVar37._28_4_ = 0;
      auVar99 = vfmadd231ps_fma(auVar37,_local_9a0,local_780);
      auVar269 = ZEXT3264(auVar229);
      auVar126 = vfmadd231ps_fma(ZEXT1632(auVar99),auVar229,auVar244);
      auVar70._4_4_ = uStack_85c;
      auVar70._0_4_ = local_860;
      auVar70._8_4_ = uStack_858;
      auVar70._12_4_ = uStack_854;
      auVar70._16_4_ = uStack_850;
      auVar70._20_4_ = uStack_84c;
      auVar70._24_4_ = uStack_848;
      auVar70._28_4_ = uStack_844;
      auVar265 = vandps_avx(auVar70,ZEXT1632(auVar126));
      auVar211._8_4_ = 0x219392ef;
      auVar211._0_8_ = 0x219392ef219392ef;
      auVar211._12_4_ = 0x219392ef;
      auVar211._16_4_ = 0x219392ef;
      auVar211._20_4_ = 0x219392ef;
      auVar211._24_4_ = 0x219392ef;
      auVar211._28_4_ = 0x219392ef;
      auVar15 = vcmpps_avx(auVar265,auVar211,1);
      auVar265 = vrcpps_avx(ZEXT1632(auVar126));
      auVar291._8_4_ = 0x3f800000;
      auVar291._0_8_ = &DAT_3f8000003f800000;
      auVar291._12_4_ = 0x3f800000;
      auVar291._16_4_ = 0x3f800000;
      auVar291._20_4_ = 0x3f800000;
      auVar291._24_4_ = 0x3f800000;
      auVar291._28_4_ = 0x3f800000;
      auVar233 = ZEXT1632(auVar126);
      auVar99 = vfnmadd213ps_fma(auVar265,auVar233,auVar291);
      auVar99 = vfmadd132ps_fma(ZEXT1632(auVar99),auVar265,auVar265);
      auVar197._0_8_ = auVar126._0_8_ ^ 0x8000000080000000;
      auVar197._8_4_ = auVar126._8_4_ ^ 0x80000000;
      auVar197._12_4_ = auVar126._12_4_ ^ 0x80000000;
      auVar197._16_4_ = 0x80000000;
      auVar197._20_4_ = 0x80000000;
      auVar197._24_4_ = 0x80000000;
      auVar197._28_4_ = 0x80000000;
      auVar252._0_4_ = auVar99._0_4_ * -auVar92._0_4_;
      auVar252._4_4_ = auVar99._4_4_ * -auVar92._4_4_;
      auVar252._8_4_ = auVar99._8_4_ * -auVar92._8_4_;
      auVar252._12_4_ = auVar99._12_4_ * -auVar92._12_4_;
      auVar252._16_4_ = 0x80000000;
      auVar252._20_4_ = 0x80000000;
      auVar252._24_4_ = 0x80000000;
      auVar252._28_4_ = 0;
      auVar265 = vcmpps_avx(auVar233,auVar197,1);
      auVar265 = vorps_avx(auVar15,auVar265);
      auVar286._8_4_ = 0xff800000;
      auVar286._0_8_ = 0xff800000ff800000;
      auVar286._12_4_ = 0xff800000;
      auVar286._16_4_ = 0xff800000;
      auVar286._20_4_ = 0xff800000;
      auVar286._24_4_ = 0xff800000;
      auVar286._28_4_ = 0xff800000;
      auVar265 = vblendvps_avx(auVar252,auVar286,auVar265);
      auVar74._4_4_ = fStack_2dc;
      auVar74._0_4_ = local_2e0;
      auVar74._8_4_ = fStack_2d8;
      auVar74._12_4_ = fStack_2d4;
      auVar74._16_4_ = fStack_2d0;
      auVar74._20_4_ = fStack_2cc;
      auVar74._24_4_ = fStack_2c8;
      auVar74._28_4_ = fStack_2c4;
      auVar199 = vmaxps_avx(auVar74,local_b40);
      auVar199 = vmaxps_avx(auVar199,auVar265);
      auVar265 = vcmpps_avx(auVar233,auVar197,6);
      auVar265 = vorps_avx(auVar15,auVar265);
      auVar234._8_4_ = 0x7f800000;
      auVar234._0_8_ = 0x7f8000007f800000;
      auVar234._12_4_ = 0x7f800000;
      auVar234._16_4_ = 0x7f800000;
      auVar234._20_4_ = 0x7f800000;
      auVar234._24_4_ = 0x7f800000;
      auVar234._28_4_ = 0x7f800000;
      auVar265 = vblendvps_avx(auVar252,auVar234,auVar265);
      auVar233 = vminps_avx(auVar17,auVar265);
      auVar265 = vsubps_avx(ZEXT832(0) << 0x20,auVar18);
      auVar15 = vsubps_avx(ZEXT832(0) << 0x20,_local_940);
      auVar38._4_4_ = auVar15._4_4_ * fVar89;
      auVar38._0_4_ = auVar15._0_4_ * fVar292;
      auVar38._8_4_ = auVar15._8_4_ * fVar293;
      auVar38._12_4_ = auVar15._12_4_ * fVar294;
      auVar38._16_4_ = auVar15._16_4_ * fVar297;
      auVar38._20_4_ = auVar15._20_4_ * fVar298;
      auVar38._24_4_ = auVar15._24_4_ * fVar299;
      auVar38._28_4_ = auVar15._28_4_;
      auVar99 = vfnmsub231ps_fma(auVar38,local_960,auVar265);
      auVar265 = vsubps_avx(ZEXT832(0) << 0x20,auVar198);
      auVar92 = vfnmadd231ps_fma(ZEXT1632(auVar99),auVar19,auVar265);
      auVar39._4_4_ = fVar254 * fVar89;
      auVar39._0_4_ = fVar248 * fVar292;
      auVar39._8_4_ = fVar255 * fVar293;
      auVar39._12_4_ = fVar256 * fVar294;
      auVar39._16_4_ = fVar257 * fVar297;
      auVar39._20_4_ = fVar258 * fVar298;
      auVar39._24_4_ = fVar259 * fVar299;
      auVar39._28_4_ = auVar265._28_4_;
      auVar99 = vfnmsub231ps_fma(auVar39,_local_9a0,local_960);
      auVar126 = vfnmadd231ps_fma(ZEXT1632(auVar99),auVar229,auVar19);
      auVar265 = vandps_avx(auVar70,ZEXT1632(auVar126));
      auVar17 = vrcpps_avx(ZEXT1632(auVar126));
      auVar112._8_4_ = 0x219392ef;
      auVar112._0_8_ = 0x219392ef219392ef;
      auVar112._12_4_ = 0x219392ef;
      auVar112._16_4_ = 0x219392ef;
      auVar112._20_4_ = 0x219392ef;
      auVar112._24_4_ = 0x219392ef;
      auVar112._28_4_ = 0x219392ef;
      auVar15 = vcmpps_avx(auVar265,auVar112,1);
      auVar198 = ZEXT1632(auVar126);
      auVar99 = vfnmadd213ps_fma(auVar17,auVar198,auVar291);
      auVar99 = vfmadd132ps_fma(ZEXT1632(auVar99),auVar17,auVar17);
      auVar253._0_8_ = auVar126._0_8_ ^ 0x8000000080000000;
      auVar253._8_4_ = auVar126._8_4_ ^ 0x80000000;
      auVar253._12_4_ = auVar126._12_4_ ^ 0x80000000;
      auVar253._16_4_ = 0x80000000;
      auVar253._20_4_ = 0x80000000;
      auVar253._24_4_ = 0x80000000;
      auVar253._28_4_ = 0x80000000;
      auVar40._4_4_ = auVar99._4_4_ * -auVar92._4_4_;
      auVar40._0_4_ = auVar99._0_4_ * -auVar92._0_4_;
      auVar40._8_4_ = auVar99._8_4_ * -auVar92._8_4_;
      auVar40._12_4_ = auVar99._12_4_ * -auVar92._12_4_;
      auVar40._16_4_ = 0x80000000;
      auVar40._20_4_ = 0x80000000;
      auVar40._24_4_ = 0x80000000;
      auVar40._28_4_ = 0x80000000;
      auVar265 = vcmpps_avx(auVar198,auVar253,1);
      auVar265 = vorps_avx(auVar265,auVar15);
      auVar265 = vblendvps_avx(auVar40,auVar286,auVar265);
      _local_700 = vmaxps_avx(auVar199,auVar265);
      auVar265 = vcmpps_avx(auVar198,auVar253,6);
      auVar265 = vorps_avx(auVar15,auVar265);
      auVar113._8_4_ = 0x7f800000;
      auVar113._0_8_ = 0x7f8000007f800000;
      auVar113._12_4_ = 0x7f800000;
      auVar113._16_4_ = 0x7f800000;
      auVar113._20_4_ = 0x7f800000;
      auVar113._24_4_ = 0x7f800000;
      auVar113._28_4_ = 0x7f800000;
      auVar265 = vblendvps_avx(auVar40,auVar113,auVar265);
      auVar114 = vandps_avx(local_260,auVar114);
      local_340 = vminps_avx(auVar233,auVar265);
      auVar265 = vcmpps_avx(_local_700,local_340,2);
      auVar15 = auVar114 & auVar265;
      if ((((((((auVar15 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar15 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar15 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar15 >> 0x7f,0) == '\0') &&
            (auVar15 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar15 >> 0xbf,0) == '\0') &&
          (auVar15 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar15[0x1f])
      {
        auVar238 = ZEXT3264(local_9c0);
      }
      else {
        local_a20._8_4_ = 0x80000000;
        local_a20._0_8_ = 0x8000000080000000;
        local_a20._12_4_ = 0x80000000;
        uStack_a10 = 0x80000000;
        uStack_a0c = 0x80000000;
        uStack_a08 = 0x80000000;
        uStack_a04 = 0x80000000;
        auVar15 = vminps_avx(local_5e0,auVar291);
        auVar56 = ZEXT812(0);
        auVar209 = ZEXT1228(auVar56) << 0x20;
        auVar15 = vmaxps_avx(auVar15,ZEXT1232(auVar56) << 0x20);
        auVar199 = vminps_avx(local_600,auVar291);
        auVar199 = vmaxps_avx(auVar199,ZEXT1232(auVar56) << 0x20);
        auVar41._4_4_ = (auVar15._4_4_ + 1.0) * 0.125;
        auVar41._0_4_ = (auVar15._0_4_ + 0.0) * 0.125;
        auVar41._8_4_ = (auVar15._8_4_ + 2.0) * 0.125;
        auVar41._12_4_ = (auVar15._12_4_ + 3.0) * 0.125;
        auVar41._16_4_ = (auVar15._16_4_ + 4.0) * 0.125;
        auVar41._20_4_ = (auVar15._20_4_ + 5.0) * 0.125;
        auVar41._24_4_ = (auVar15._24_4_ + 6.0) * 0.125;
        auVar41._28_4_ = auVar15._28_4_ + 7.0;
        auVar99 = vfmadd213ps_fma(auVar41,auVar104,local_7e0);
        auVar42._4_4_ = (auVar199._4_4_ + 1.0) * 0.125;
        auVar42._0_4_ = (auVar199._0_4_ + 0.0) * 0.125;
        auVar42._8_4_ = (auVar199._8_4_ + 2.0) * 0.125;
        auVar42._12_4_ = (auVar199._12_4_ + 3.0) * 0.125;
        auVar42._16_4_ = (auVar199._16_4_ + 4.0) * 0.125;
        auVar42._20_4_ = (auVar199._20_4_ + 5.0) * 0.125;
        auVar42._24_4_ = (auVar199._24_4_ + 6.0) * 0.125;
        auVar42._28_4_ = auVar199._28_4_ + 7.0;
        auVar92 = vfmadd213ps_fma(auVar42,auVar104,local_7e0);
        auVar15 = vminps_avx(local_820,auVar210);
        auVar199 = vminps_avx(auVar20,auVar21);
        auVar15 = vminps_avx(auVar15,auVar199);
        auVar107 = vsubps_avx(auVar15,auVar107);
        auVar114 = vandps_avx(auVar265,auVar114);
        local_5e0 = ZEXT1632(auVar99);
        local_600 = ZEXT1632(auVar92);
        auVar43._4_4_ = auVar107._4_4_ * 0.99999976;
        auVar43._0_4_ = auVar107._0_4_ * 0.99999976;
        auVar43._8_4_ = auVar107._8_4_ * 0.99999976;
        auVar43._12_4_ = auVar107._12_4_ * 0.99999976;
        auVar43._16_4_ = auVar107._16_4_ * 0.99999976;
        auVar43._20_4_ = auVar107._20_4_ * 0.99999976;
        auVar43._24_4_ = auVar107._24_4_ * 0.99999976;
        auVar43._28_4_ = 0x3f7ffffc;
        auVar265 = vmaxps_avx(ZEXT832(0) << 0x20,auVar43);
        auVar44._4_4_ = auVar265._4_4_ * auVar265._4_4_;
        auVar44._0_4_ = auVar265._0_4_ * auVar265._0_4_;
        auVar44._8_4_ = auVar265._8_4_ * auVar265._8_4_;
        auVar44._12_4_ = auVar265._12_4_ * auVar265._12_4_;
        auVar44._16_4_ = auVar265._16_4_ * auVar265._16_4_;
        auVar44._20_4_ = auVar265._20_4_ * auVar265._20_4_;
        auVar44._24_4_ = auVar265._24_4_ * auVar265._24_4_;
        auVar44._28_4_ = auVar265._28_4_;
        auVar107 = vsubps_avx(auVar16,auVar44);
        auVar45._4_4_ = auVar107._4_4_ * fVar157 * 4.0;
        auVar45._0_4_ = auVar107._0_4_ * fVar155 * 4.0;
        auVar45._8_4_ = auVar107._8_4_ * fVar176 * 4.0;
        auVar45._12_4_ = auVar107._12_4_ * fVar177 * 4.0;
        auVar45._16_4_ = auVar107._16_4_ * fVar178 * 4.0;
        auVar45._20_4_ = auVar107._20_4_ * fVar179 * 4.0;
        auVar45._24_4_ = auVar107._24_4_ * fVar239 * 4.0;
        auVar45._28_4_ = auVar265._28_4_;
        auVar15 = vsubps_avx(auVar31,auVar45);
        local_a40 = vcmpps_avx(auVar15,ZEXT1232(auVar56) << 0x20,5);
        auVar265 = local_a40;
        if ((((((((local_a40 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (local_a40 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (local_a40 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(local_a40 >> 0x7f,0) == '\0') &&
              (local_a40 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(local_a40 >> 0xbf,0) == '\0') &&
            (local_a40 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < local_a40[0x1f]) {
          auVar56 = ZEXT412(0);
          auVar166 = ZEXT1232(auVar56) << 0x20;
          local_8a0 = ZEXT1232(auVar56) << 0x20;
          _local_8c0 = ZEXT1232(auVar56) << 0x20;
          auVar199 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar235._8_4_ = 0x7f800000;
          auVar235._0_8_ = 0x7f8000007f800000;
          auVar235._12_4_ = 0x7f800000;
          auVar235._16_4_ = 0x7f800000;
          auVar235._20_4_ = 0x7f800000;
          auVar235._24_4_ = 0x7f800000;
          auVar235._28_4_ = 0x7f800000;
          auVar246._8_4_ = 0xff800000;
          auVar246._0_8_ = 0xff800000ff800000;
          auVar246._12_4_ = 0xff800000;
          auVar246._16_4_ = 0xff800000;
          auVar246._20_4_ = 0xff800000;
          auVar246._24_4_ = 0xff800000;
          auVar246._28_4_ = 0xff800000;
          local_a40 = auVar18;
          _local_880 = local_8a0;
        }
        else {
          auVar167._0_4_ = fVar155 + fVar155;
          auVar167._4_4_ = fVar157 + fVar157;
          auVar167._8_4_ = fVar176 + fVar176;
          auVar167._12_4_ = fVar177 + fVar177;
          auVar167._16_4_ = fVar178 + fVar178;
          auVar167._20_4_ = fVar179 + fVar179;
          auVar167._24_4_ = fVar239 + fVar239;
          auVar167._28_4_ = fVar125 + fVar125;
          auVar199 = vrcpps_avx(auVar167);
          auVar99 = vfnmadd213ps_fma(auVar167,auVar199,auVar291);
          auVar99 = vfmadd132ps_fma(ZEXT1632(auVar99),auVar199,auVar199);
          auVar199 = vsqrtps_avx(auVar15);
          uVar60 = CONCAT44(local_240._4_4_,local_240._0_4_);
          auVar212._0_8_ = uVar60 ^ 0x8000000080000000;
          auVar212._8_4_ = -local_240._8_4_;
          auVar212._12_4_ = -local_240._12_4_;
          auVar212._16_4_ = -local_240._16_4_;
          auVar212._20_4_ = -local_240._20_4_;
          auVar212._24_4_ = -local_240._24_4_;
          auVar212._28_4_ = -local_240._28_4_;
          auVar233 = vsubps_avx(auVar212,auVar199);
          auVar199 = vsubps_avx(auVar199,local_240);
          fVar176 = auVar233._0_4_ * auVar99._0_4_;
          fVar297 = auVar233._4_4_ * auVar99._4_4_;
          auVar46._4_4_ = fVar297;
          auVar46._0_4_ = fVar176;
          fVar298 = auVar233._8_4_ * auVar99._8_4_;
          auVar46._8_4_ = fVar298;
          fVar299 = auVar233._12_4_ * auVar99._12_4_;
          auVar46._12_4_ = fVar299;
          fVar177 = auVar233._16_4_ * 0.0;
          auVar46._16_4_ = fVar177;
          fVar178 = auVar233._20_4_ * 0.0;
          auVar46._20_4_ = fVar178;
          fVar179 = auVar233._24_4_ * 0.0;
          auVar46._24_4_ = fVar179;
          auVar46._28_4_ = local_260._28_4_;
          fVar125 = auVar199._0_4_ * auVar99._0_4_;
          fVar292 = auVar199._4_4_ * auVar99._4_4_;
          auVar47._4_4_ = fVar292;
          auVar47._0_4_ = fVar125;
          fVar89 = auVar199._8_4_ * auVar99._8_4_;
          auVar47._8_4_ = fVar89;
          fVar155 = auVar199._12_4_ * auVar99._12_4_;
          auVar47._12_4_ = fVar155;
          fVar293 = auVar199._16_4_ * 0.0;
          auVar47._16_4_ = fVar293;
          fVar157 = auVar199._20_4_ * 0.0;
          auVar47._20_4_ = fVar157;
          fVar294 = auVar199._24_4_ * 0.0;
          auVar47._24_4_ = fVar294;
          auVar47._28_4_ = 0x3f800000;
          auVar99 = vfmadd213ps_fma(local_7a0,auVar46,local_7c0);
          auVar92 = vfmadd213ps_fma(local_7a0,auVar47,local_7c0);
          auVar48._28_4_ = auVar233._28_4_;
          auVar48._0_28_ =
               ZEXT1628(CONCAT412(fVar158 * auVar99._12_4_,
                                  CONCAT48(fVar156 * auVar99._8_4_,
                                           CONCAT44(fVar159 * auVar99._4_4_,fVar154 * auVar99._0_4_)
                                          )));
          auVar199 = ZEXT1632(CONCAT412(auVar92._12_4_ * fVar158,
                                        CONCAT48(auVar92._8_4_ * fVar156,
                                                 CONCAT44(auVar92._4_4_ * fVar159,
                                                          auVar92._0_4_ * fVar154))));
          auVar99 = vfmadd213ps_fma(auVar13,auVar48,auVar195);
          auVar92 = vfmadd213ps_fma(auVar13,auVar199,auVar195);
          auVar126 = vfmadd213ps_fma(auVar166,auVar48,auVar105);
          auVar181 = vfmadd213ps_fma(auVar166,auVar199,auVar105);
          auVar204 = vfmadd213ps_fma(auVar48,auVar14,auVar295);
          auVar91 = vfmadd213ps_fma(auVar14,auVar199,auVar295);
          auVar49._4_4_ = fVar297 * fVar87;
          auVar49._0_4_ = fVar176 * fVar87;
          auVar49._8_4_ = fVar298 * fVar87;
          auVar49._12_4_ = fVar299 * fVar87;
          auVar49._16_4_ = fVar177 * fVar87;
          auVar49._20_4_ = fVar178 * fVar87;
          auVar49._24_4_ = fVar179 * fVar87;
          auVar49._28_4_ = 0;
          auVar166 = vsubps_avx(auVar49,ZEXT1632(auVar99));
          auVar200._0_4_ = fVar176 * (float)local_9a0._0_4_;
          auVar200._4_4_ = fVar297 * (float)local_9a0._4_4_;
          auVar200._8_4_ = fVar298 * fStack_998;
          auVar200._12_4_ = fVar299 * fStack_994;
          auVar200._16_4_ = fVar177 * fStack_990;
          auVar200._20_4_ = fVar178 * fStack_98c;
          auVar200._24_4_ = fVar179 * fStack_988;
          auVar200._28_4_ = 0;
          auVar199 = vsubps_avx(auVar200,ZEXT1632(auVar126));
          auVar236._0_4_ = fVar248 * fVar176;
          auVar236._4_4_ = fVar254 * fVar297;
          auVar236._8_4_ = fVar255 * fVar298;
          auVar236._12_4_ = fVar256 * fVar299;
          auVar236._16_4_ = fVar257 * fVar177;
          auVar236._20_4_ = fVar258 * fVar178;
          auVar236._24_4_ = fVar259 * fVar179;
          auVar236._28_4_ = 0;
          auVar13 = vsubps_avx(auVar236,ZEXT1632(auVar204));
          auVar209 = auVar13._0_28_;
          auVar50._4_4_ = fVar292 * fVar87;
          auVar50._0_4_ = fVar125 * fVar87;
          auVar50._8_4_ = fVar89 * fVar87;
          auVar50._12_4_ = fVar155 * fVar87;
          auVar50._16_4_ = fVar293 * fVar87;
          auVar50._20_4_ = fVar157 * fVar87;
          auVar50._24_4_ = fVar294 * fVar87;
          auVar50._28_4_ = 0;
          _local_880 = vsubps_avx(auVar50,ZEXT1632(auVar92));
          auVar51._4_4_ = fVar292 * (float)local_9a0._4_4_;
          auVar51._0_4_ = fVar125 * (float)local_9a0._0_4_;
          auVar51._8_4_ = fVar89 * fStack_998;
          auVar51._12_4_ = fVar155 * fStack_994;
          auVar51._16_4_ = fVar293 * fStack_990;
          auVar51._20_4_ = fVar157 * fStack_98c;
          auVar51._24_4_ = fVar294 * fStack_988;
          auVar51._28_4_ = local_880._28_4_;
          local_8a0 = vsubps_avx(auVar51,ZEXT1632(auVar181));
          auVar52._4_4_ = fVar254 * fVar292;
          auVar52._0_4_ = fVar248 * fVar125;
          auVar52._8_4_ = fVar255 * fVar89;
          auVar52._12_4_ = fVar256 * fVar155;
          auVar52._16_4_ = fVar257 * fVar293;
          auVar52._20_4_ = fVar258 * fVar157;
          auVar52._24_4_ = fVar259 * fVar294;
          auVar52._28_4_ = local_8a0._28_4_;
          _local_8c0 = vsubps_avx(auVar52,ZEXT1632(auVar91));
          auVar14 = vcmpps_avx(auVar15,_DAT_02020f00,5);
          auVar237._8_4_ = 0x7f800000;
          auVar237._0_8_ = 0x7f8000007f800000;
          auVar237._12_4_ = 0x7f800000;
          auVar237._16_4_ = 0x7f800000;
          auVar237._20_4_ = 0x7f800000;
          auVar237._24_4_ = 0x7f800000;
          auVar237._28_4_ = 0x7f800000;
          auVar235 = vblendvps_avx(auVar237,auVar46,auVar14);
          auVar71._4_4_ = uStack_85c;
          auVar71._0_4_ = local_860;
          auVar71._8_4_ = uStack_858;
          auVar71._12_4_ = uStack_854;
          auVar71._16_4_ = uStack_850;
          auVar71._20_4_ = uStack_84c;
          auVar71._24_4_ = uStack_848;
          auVar71._28_4_ = uStack_844;
          auVar13 = vandps_avx(auVar71,local_300);
          auVar13 = vmaxps_avx(local_540,auVar13);
          auVar53._4_4_ = auVar13._4_4_ * 1.9073486e-06;
          auVar53._0_4_ = auVar13._0_4_ * 1.9073486e-06;
          auVar53._8_4_ = auVar13._8_4_ * 1.9073486e-06;
          auVar53._12_4_ = auVar13._12_4_ * 1.9073486e-06;
          auVar53._16_4_ = auVar13._16_4_ * 1.9073486e-06;
          auVar53._20_4_ = auVar13._20_4_ * 1.9073486e-06;
          auVar53._24_4_ = auVar13._24_4_ * 1.9073486e-06;
          auVar53._28_4_ = auVar13._28_4_;
          auVar12 = vandps_avx(auVar71,auVar12);
          auVar12 = vcmpps_avx(auVar12,auVar53,1);
          auVar269 = ZEXT3264(auVar12);
          auVar247._8_4_ = 0xff800000;
          auVar247._0_8_ = 0xff800000ff800000;
          auVar247._12_4_ = 0xff800000;
          auVar247._16_4_ = 0xff800000;
          auVar247._20_4_ = 0xff800000;
          auVar247._24_4_ = 0xff800000;
          auVar247._28_4_ = 0xff800000;
          auVar246 = vblendvps_avx(auVar247,auVar47,auVar14);
          auVar13 = auVar14 & auVar12;
          if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar13 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar13 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar13 >> 0x7f,0) != '\0') ||
                (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar13 >> 0xbf,0) != '\0') ||
              (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar13[0x1f] < '\0') {
            auVar265 = vandps_avx(auVar12,auVar14);
            auVar12 = vcmpps_avx(auVar107,_DAT_02020f00,2);
            auVar284._8_4_ = 0xff800000;
            auVar284._0_8_ = 0xff800000ff800000;
            auVar284._12_4_ = 0xff800000;
            auVar284._16_4_ = 0xff800000;
            auVar284._20_4_ = 0xff800000;
            auVar284._24_4_ = 0xff800000;
            auVar284._28_4_ = 0xff800000;
            auVar287._8_4_ = 0x7f800000;
            auVar287._0_8_ = 0x7f8000007f800000;
            auVar287._12_4_ = 0x7f800000;
            auVar287._16_4_ = 0x7f800000;
            auVar287._20_4_ = 0x7f800000;
            auVar287._24_4_ = 0x7f800000;
            auVar287._28_4_ = 0x7f800000;
            auVar107 = vblendvps_avx(auVar287,auVar284,auVar12);
            auVar99 = vpackssdw_avx(auVar265._0_16_,auVar265._16_16_);
            auVar13 = vpmovsxwd_avx2(auVar99);
            auVar269 = ZEXT3264(auVar13);
            auVar235 = vblendvps_avx(auVar235,auVar107,auVar13);
            auVar107 = vblendvps_avx(auVar284,auVar287,auVar12);
            auVar246 = vblendvps_avx(auVar246,auVar107,auVar13);
            auVar266._0_8_ = auVar265._0_8_ ^ 0xffffffffffffffff;
            auVar266._8_4_ = auVar265._8_4_ ^ 0xffffffff;
            auVar266._12_4_ = auVar265._12_4_ ^ 0xffffffff;
            auVar266._16_4_ = auVar265._16_4_ ^ 0xffffffff;
            auVar266._20_4_ = auVar265._20_4_ ^ 0xffffffff;
            auVar266._24_4_ = auVar265._24_4_ ^ 0xffffffff;
            auVar266._28_4_ = auVar265._28_4_ ^ 0xffffffff;
            auVar265 = vorps_avx(auVar12,auVar266);
            auVar265 = vandps_avx(auVar265,auVar14);
          }
        }
        local_4c0 = _local_700;
        local_4a0 = vminps_avx(local_340,auVar235);
        _local_680 = vmaxps_avx(_local_700,auVar246);
        _local_360 = _local_680;
        auVar107 = vcmpps_avx(_local_700,local_4a0,2);
        local_640 = vandps_avx(auVar107,auVar114);
        auVar107 = vcmpps_avx(_local_680,local_340,2);
        local_740 = vandps_avx(auVar107,auVar114);
        auVar114 = vorps_avx(local_740,local_640);
        auVar250 = local_aa0._0_28_;
        if ((((((((auVar114 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar114 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar114 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar114 >> 0x7f,0) == '\0') &&
              (auVar114 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar114 >> 0xbf,0) == '\0') &&
            (auVar114 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar114[0x1f]) {
          auVar238 = ZEXT3264(local_9c0);
        }
        else {
          local_6c0._0_8_ = auVar265._0_8_ ^ 0xffffffffffffffff;
          local_6c0._8_4_ = auVar265._8_4_ ^ 0xffffffff;
          local_6c0._12_4_ = auVar265._12_4_ ^ 0xffffffff;
          local_6c0._16_4_ = auVar265._16_4_ ^ 0xffffffff;
          local_6c0._20_4_ = auVar265._20_4_ ^ 0xffffffff;
          local_6c0._24_4_ = auVar265._24_4_ ^ 0xffffffff;
          local_6c0._28_4_ = auVar265._28_4_ ^ 0xffffffff;
          auVar54._4_4_ = fVar254 * auVar209._4_4_;
          auVar54._0_4_ = fVar248 * auVar209._0_4_;
          auVar54._8_4_ = fVar255 * auVar209._8_4_;
          auVar54._12_4_ = fVar256 * auVar209._12_4_;
          auVar54._16_4_ = fVar257 * auVar209._16_4_;
          auVar54._20_4_ = fVar258 * auVar209._20_4_;
          auVar54._24_4_ = fVar259 * auVar209._24_4_;
          auVar54._28_4_ = auVar114._28_4_;
          auVar99 = vfmadd213ps_fma(auVar199,_local_9a0,auVar54);
          auVar99 = vfmadd213ps_fma(auVar166,auVar229,ZEXT1632(auVar99));
          auVar72._4_4_ = uStack_85c;
          auVar72._0_4_ = local_860;
          auVar72._8_4_ = uStack_858;
          auVar72._12_4_ = uStack_854;
          auVar72._16_4_ = uStack_850;
          auVar72._20_4_ = uStack_84c;
          auVar72._24_4_ = uStack_848;
          auVar72._28_4_ = uStack_844;
          auVar114 = vandps_avx(ZEXT1632(auVar99),auVar72);
          auVar145._8_4_ = 0x3e99999a;
          auVar145._0_8_ = 0x3e99999a3e99999a;
          auVar145._12_4_ = 0x3e99999a;
          auVar145._16_4_ = 0x3e99999a;
          auVar145._20_4_ = 0x3e99999a;
          auVar145._24_4_ = 0x3e99999a;
          auVar145._28_4_ = 0x3e99999a;
          auVar114 = vcmpps_avx(auVar114,auVar145,1);
          auVar114 = vorps_avx(auVar114,local_6c0);
          auVar146._8_4_ = 3;
          auVar146._0_8_ = 0x300000003;
          auVar146._12_4_ = 3;
          auVar146._16_4_ = 3;
          auVar146._20_4_ = 3;
          auVar146._24_4_ = 3;
          auVar146._28_4_ = 3;
          auVar168._8_4_ = 2;
          auVar168._0_8_ = 0x200000002;
          auVar168._12_4_ = 2;
          auVar168._16_4_ = 2;
          auVar168._20_4_ = 2;
          auVar168._24_4_ = 2;
          auVar168._28_4_ = 2;
          auVar114 = vblendvps_avx(auVar168,auVar146,auVar114);
          uVar85 = (undefined4)uVar81;
          local_6e0._4_4_ = uVar85;
          local_6e0._0_4_ = uVar85;
          local_6e0._8_4_ = uVar85;
          local_6e0._12_4_ = uVar85;
          local_6e0._16_4_ = uVar85;
          local_6e0._20_4_ = uVar85;
          local_6e0._24_4_ = uVar85;
          local_6e0._28_4_ = uVar85;
          local_660 = vpcmpgtd_avx2(auVar114,local_6e0);
          local_720 = vpandn_avx2(local_660,local_640);
          auVar238 = ZEXT3264(local_720);
          auVar114 = local_640 & ~local_660;
          auStack_758 = auVar210._8_24_;
          fStack_b7c = auVar160._4_4_;
          fStack_b78 = auVar160._8_4_;
          fStack_b74 = auVar160._12_4_;
          local_6a0 = local_740;
          if ((((((((auVar114 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar114 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar114 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar114 >> 0x7f,0) != '\0') ||
                (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar114 >> 0xbf,0) != '\0') ||
              (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar114[0x1f] < '\0') {
            auVar92 = vminps_avx(auVar9,auVar93);
            auVar99 = vmaxps_avx(auVar9,auVar93);
            auVar126 = vminps_avx(auVar94,auVar160);
            auVar181 = vminps_avx(auVar92,auVar126);
            auVar92 = vmaxps_avx(auVar94,auVar160);
            auVar126 = vmaxps_avx(auVar99,auVar92);
            auVar99 = vandps_avx(auVar181,local_9e0);
            auVar92 = vandps_avx(auVar126,local_9e0);
            auVar99 = vmaxps_avx(auVar99,auVar92);
            auVar92 = vmovshdup_avx(auVar99);
            auVar92 = vmaxss_avx(auVar92,auVar99);
            auVar99 = vshufpd_avx(auVar99,auVar99,1);
            auVar99 = vmaxss_avx(auVar99,auVar92);
            local_a40._0_4_ = auVar99._0_4_ * 1.9073486e-06;
            local_800 = vshufps_avx(auVar126,auVar126,0xff);
            local_840._4_4_ = (float)local_700._4_4_ + (float)local_980._4_4_;
            local_840._0_4_ = (float)local_700._0_4_ + (float)local_980._0_4_;
            fStack_838 = fStack_6f8 + fStack_978;
            fStack_834 = fStack_6f4 + fStack_974;
            fStack_830 = fStack_6f0 + fStack_970;
            fStack_82c = fStack_6ec + fStack_96c;
            fStack_828 = fStack_6e8 + fStack_968;
            fStack_824 = fStack_6e4 + fStack_964;
            do {
              auVar147._8_4_ = 0x7f800000;
              auVar147._0_8_ = 0x7f8000007f800000;
              auVar147._12_4_ = 0x7f800000;
              auVar147._16_4_ = 0x7f800000;
              auVar147._20_4_ = 0x7f800000;
              auVar147._24_4_ = 0x7f800000;
              auVar147._28_4_ = 0x7f800000;
              auVar114 = auVar238._0_32_;
              auVar265 = vblendvps_avx(auVar147,_local_700,auVar114);
              auVar107 = vshufps_avx(auVar265,auVar265,0xb1);
              auVar107 = vminps_avx(auVar265,auVar107);
              auVar12 = vshufpd_avx(auVar107,auVar107,5);
              auVar107 = vminps_avx(auVar107,auVar12);
              auVar12 = vpermpd_avx2(auVar107,0x4e);
              auVar107 = vminps_avx(auVar107,auVar12);
              auVar265 = vcmpps_avx(auVar265,auVar107,0);
              auVar107 = auVar114 & auVar265;
              if ((((((((auVar107 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar107 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar107 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar107 >> 0x7f,0) != '\0') ||
                    (auVar107 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar107 >> 0xbf,0) != '\0') ||
                  (auVar107 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar107[0x1f] < '\0') {
                auVar114 = vandps_avx(auVar265,auVar114);
              }
              local_820._0_8_ = uVar84;
              uVar80 = vmovmskps_avx(auVar114);
              iVar79 = 0;
              for (; (uVar80 & 1) == 0; uVar80 = uVar80 >> 1 | 0x80000000) {
                iVar79 = iVar79 + 1;
              }
              uVar80 = iVar79 << 2;
              *(undefined4 *)(local_720 + uVar80) = 0;
              fVar125 = *(float *)(local_5e0 + uVar80);
              fVar292 = *(float *)(local_4c0 + uVar80);
              fVar154 = auVar5._0_4_;
              if ((float)local_9f0._0_4_ < 0.0) {
                fVar154 = sqrtf((float)local_9f0._0_4_);
              }
              lVar82 = 5;
              do {
                fVar89 = 1.0 - fVar125;
                auVar127._0_4_ = fVar123 * fVar125;
                auVar127._4_4_ = auVar93._4_4_ * fVar125;
                auVar127._8_4_ = auVar93._8_4_ * fVar125;
                auVar127._12_4_ = auVar93._12_4_ * fVar125;
                auVar161._4_4_ = fVar89;
                auVar161._0_4_ = fVar89;
                auVar161._8_4_ = fVar89;
                auVar161._12_4_ = fVar89;
                auVar99 = vfmadd231ps_fma(auVar127,auVar161,auVar9);
                auVar182._0_4_ = fVar124 * fVar125;
                auVar182._4_4_ = auVar94._4_4_ * fVar125;
                auVar182._8_4_ = auVar94._8_4_ * fVar125;
                auVar182._12_4_ = auVar94._12_4_ * fVar125;
                auVar92 = vfmadd231ps_fma(auVar182,auVar161,auVar93);
                auVar225._0_4_ = fVar125 * auVar92._0_4_;
                auVar225._4_4_ = fVar125 * auVar92._4_4_;
                auVar225._8_4_ = fVar125 * auVar92._8_4_;
                auVar225._12_4_ = fVar125 * auVar92._12_4_;
                auVar126 = vfmadd231ps_fma(auVar225,auVar161,auVar99);
                auVar128._0_4_ = fVar125 * fVar180;
                auVar128._4_4_ = fVar125 * fStack_b7c;
                auVar128._8_4_ = fVar125 * fStack_b78;
                auVar128._12_4_ = fVar125 * fStack_b74;
                auVar99 = vfmadd231ps_fma(auVar128,auVar161,auVar94);
                auVar205._0_4_ = fVar125 * auVar99._0_4_;
                auVar205._4_4_ = fVar125 * auVar99._4_4_;
                auVar205._8_4_ = fVar125 * auVar99._8_4_;
                auVar205._12_4_ = fVar125 * auVar99._12_4_;
                auVar92 = vfmadd231ps_fma(auVar205,auVar161,auVar92);
                auVar129._4_4_ = fVar292;
                auVar129._0_4_ = fVar292;
                auVar129._8_4_ = fVar292;
                auVar129._12_4_ = fVar292;
                auVar99 = vfmadd213ps_fma(auVar129,local_9d0,_DAT_01feba10);
                auVar95._0_4_ = fVar125 * auVar92._0_4_;
                auVar95._4_4_ = fVar125 * auVar92._4_4_;
                auVar95._8_4_ = fVar125 * auVar92._8_4_;
                auVar95._12_4_ = fVar125 * auVar92._12_4_;
                auVar181 = vfmadd231ps_fma(auVar95,auVar126,auVar161);
                local_780._0_16_ = auVar181;
                auVar99 = vsubps_avx(auVar99,auVar181);
                _local_940 = auVar99;
                auVar99 = vdpps_avx(auVar99,auVar99,0x7f);
                local_a20 = auVar99;
                if (auVar99._0_4_ < 0.0) {
                  auVar238._0_4_ = sqrtf(auVar99._0_4_);
                  auVar238._4_60_ = extraout_var;
                  auVar99 = auVar238._0_16_;
                }
                else {
                  auVar99 = vsqrtss_avx(auVar99,auVar99);
                }
                auVar92 = vsubps_avx(auVar92,auVar126);
                auVar241._0_4_ = auVar92._0_4_ * 3.0;
                auVar241._4_4_ = auVar92._4_4_ * 3.0;
                auVar241._8_4_ = auVar92._8_4_ * 3.0;
                auVar241._12_4_ = auVar92._12_4_ * 3.0;
                auVar92 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),ZEXT416((uint)fVar89),
                                          ZEXT416((uint)fVar125));
                auVar126 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),ZEXT416((uint)fVar125),
                                           ZEXT416((uint)fVar89));
                fVar89 = fVar89 * 6.0;
                fVar159 = auVar92._0_4_ * 6.0;
                fVar155 = auVar126._0_4_ * 6.0;
                fVar293 = fVar125 * 6.0;
                auVar183._0_4_ = fVar293 * fVar180;
                auVar183._4_4_ = fVar293 * fStack_b7c;
                auVar183._8_4_ = fVar293 * fStack_b78;
                auVar183._12_4_ = fVar293 * fStack_b74;
                auVar130._4_4_ = fVar155;
                auVar130._0_4_ = fVar155;
                auVar130._8_4_ = fVar155;
                auVar130._12_4_ = fVar155;
                auVar92 = vfmadd132ps_fma(auVar130,auVar183,auVar94);
                auVar184._4_4_ = fVar159;
                auVar184._0_4_ = fVar159;
                auVar184._8_4_ = fVar159;
                auVar184._12_4_ = fVar159;
                auVar92 = vfmadd132ps_fma(auVar184,auVar92,auVar93);
                auVar126 = vdpps_avx(auVar241,auVar241,0x7f);
                auVar131._4_4_ = fVar89;
                auVar131._0_4_ = fVar89;
                auVar131._8_4_ = fVar89;
                auVar131._12_4_ = fVar89;
                auVar204 = vfmadd132ps_fma(auVar131,auVar92,auVar9);
                auVar92 = vblendps_avx(auVar126,_DAT_01feba10,0xe);
                auVar181 = vrsqrtss_avx(auVar92,auVar92);
                fVar155 = auVar126._0_4_;
                fVar89 = auVar181._0_4_;
                auVar181 = vdpps_avx(auVar241,auVar204,0x7f);
                fVar89 = fVar89 * 1.5 + fVar155 * -0.5 * fVar89 * fVar89 * fVar89;
                auVar132._0_4_ = auVar204._0_4_ * fVar155;
                auVar132._4_4_ = auVar204._4_4_ * fVar155;
                auVar132._8_4_ = auVar204._8_4_ * fVar155;
                auVar132._12_4_ = auVar204._12_4_ * fVar155;
                fVar159 = auVar181._0_4_;
                auVar226._0_4_ = auVar241._0_4_ * fVar159;
                auVar226._4_4_ = auVar241._4_4_ * fVar159;
                auVar226._8_4_ = auVar241._8_4_ * fVar159;
                auVar226._12_4_ = auVar241._12_4_ * fVar159;
                auVar181 = vsubps_avx(auVar132,auVar226);
                auVar92 = vrcpss_avx(auVar92,auVar92);
                auVar204 = vfnmadd213ss_fma(auVar92,auVar126,ZEXT416(0x40000000));
                fVar159 = auVar92._0_4_ * auVar204._0_4_;
                auVar92 = vmaxss_avx(ZEXT416((uint)local_a40._0_4_),
                                     ZEXT416((uint)(fVar292 * fVar154 * 1.9073486e-06)));
                uVar81 = CONCAT44(auVar241._4_4_,auVar241._0_4_);
                auVar262._0_8_ = uVar81 ^ 0x8000000080000000;
                auVar262._8_4_ = -auVar241._8_4_;
                auVar262._12_4_ = -auVar241._12_4_;
                local_960._0_4_ = fVar89 * auVar181._0_4_ * fVar159;
                local_960._4_4_ = fVar89 * auVar181._4_4_ * fVar159;
                local_960._8_4_ = fVar89 * auVar181._8_4_ * fVar159;
                local_960._12_4_ = fVar89 * auVar181._12_4_ * fVar159;
                local_a80._0_4_ = auVar241._0_4_ * fVar89;
                local_a80._4_4_ = auVar241._4_4_ * fVar89;
                local_a80._8_4_ = auVar241._8_4_ * fVar89;
                local_a80._12_4_ = auVar241._12_4_ * fVar89;
                if (fVar155 < -fVar155) {
                  local_a60._0_16_ = auVar262;
                  fVar89 = sqrtf(fVar155);
                  auVar99 = ZEXT416(auVar99._0_4_);
                  auVar262 = local_a60._0_16_;
                  auVar126 = local_a80._0_16_;
                }
                else {
                  auVar126 = vsqrtss_avx(auVar126,auVar126);
                  fVar89 = auVar126._0_4_;
                  auVar126 = local_a80._0_16_;
                }
                auVar269 = ZEXT1664(auVar126);
                auVar181 = vdpps_avx(_local_940,auVar126,0x7f);
                auVar164 = vfmadd213ss_fma(ZEXT416((uint)local_a40._0_4_),auVar99,
                                           ZEXT416((uint)auVar92._0_4_));
                auVar204 = vdpps_avx(auVar262,auVar126,0x7f);
                auVar91 = vdpps_avx(_local_940,local_960._0_16_,0x7f);
                auVar133 = vdpps_avx(local_9d0,auVar126,0x7f);
                auVar99 = vfmadd213ss_fma(ZEXT416((uint)(auVar99._0_4_ + 1.0)),
                                          ZEXT416((uint)((float)local_a40._0_4_ / fVar89)),auVar164)
                ;
                local_a60._0_4_ = auVar99._0_4_;
                auVar96._0_4_ = auVar181._0_4_ * auVar181._0_4_;
                auVar96._4_4_ = auVar181._4_4_ * auVar181._4_4_;
                auVar96._8_4_ = auVar181._8_4_ * auVar181._8_4_;
                auVar96._12_4_ = auVar181._12_4_ * auVar181._12_4_;
                auVar99 = vdpps_avx(_local_940,auVar262,0x7f);
                auVar220 = vsubps_avx(local_a20,auVar96);
                auVar164 = vrsqrtss_avx(auVar220,auVar220);
                fVar159 = auVar220._0_4_;
                fVar89 = auVar164._0_4_;
                fVar89 = fVar89 * 1.5 + fVar159 * -0.5 * fVar89 * fVar89 * fVar89;
                auVar164 = vdpps_avx(_local_940,local_9d0,0x7f);
                local_a80._0_16_ = ZEXT416((uint)(auVar204._0_4_ + auVar91._0_4_));
                local_960._0_16_ = vfnmadd231ss_fma(auVar99,auVar181,local_a80._0_16_);
                auVar99 = vfnmadd231ss_fma(auVar164,auVar181,auVar133);
                if (fVar159 < 0.0) {
                  local_7a0._0_16_ = auVar133;
                  local_7c0._0_4_ = fVar89;
                  local_7e0._0_16_ = auVar99;
                  auVar269 = ZEXT1664(auVar126);
                  fVar159 = sqrtf(fVar159);
                  fVar89 = (float)local_7c0._0_4_;
                  auVar99 = local_7e0._0_16_;
                  auVar133 = local_7a0._0_16_;
                }
                else {
                  auVar126 = vsqrtss_avx(auVar220,auVar220);
                  fVar159 = auVar126._0_4_;
                }
                auVar126 = vpermilps_avx(local_780._0_16_,0xff);
                auVar91 = vpermilps_avx(auVar241,0xff);
                auVar204 = vfmsub213ss_fma(local_960._0_16_,ZEXT416((uint)fVar89),auVar91);
                auVar185._0_8_ = auVar133._0_8_ ^ 0x8000000080000000;
                auVar185._8_4_ = auVar133._8_4_ ^ 0x80000000;
                auVar185._12_4_ = auVar133._12_4_ ^ 0x80000000;
                auVar206._0_8_ = auVar204._0_8_ ^ 0x8000000080000000;
                auVar206._8_4_ = auVar204._8_4_ ^ 0x80000000;
                auVar206._12_4_ = auVar204._12_4_ ^ 0x80000000;
                auVar99 = ZEXT416((uint)(auVar99._0_4_ * fVar89));
                auVar204 = vfmsub231ss_fma(ZEXT416((uint)(auVar133._0_4_ * auVar204._0_4_)),
                                           local_a80._0_16_,auVar99);
                auVar99 = vinsertps_avx(auVar99,auVar185,0x10);
                uVar85 = auVar204._0_4_;
                auVar186._4_4_ = uVar85;
                auVar186._0_4_ = uVar85;
                auVar186._8_4_ = uVar85;
                auVar186._12_4_ = uVar85;
                auVar99 = vdivps_avx(auVar99,auVar186);
                auVar133 = ZEXT416((uint)(fVar159 - auVar126._0_4_));
                auVar204 = vinsertps_avx(auVar181,auVar133,0x10);
                auVar162._0_4_ = auVar204._0_4_ * auVar99._0_4_;
                auVar162._4_4_ = auVar204._4_4_ * auVar99._4_4_;
                auVar162._8_4_ = auVar204._8_4_ * auVar99._8_4_;
                auVar162._12_4_ = auVar204._12_4_ * auVar99._12_4_;
                auVar99 = vinsertps_avx(auVar206,local_a80._0_16_,0x1c);
                auVar99 = vdivps_avx(auVar99,auVar186);
                auVar126 = vhaddps_avx(auVar162,auVar162);
                auVar187._0_4_ = auVar204._0_4_ * auVar99._0_4_;
                auVar187._4_4_ = auVar204._4_4_ * auVar99._4_4_;
                auVar187._8_4_ = auVar204._8_4_ * auVar99._8_4_;
                auVar187._12_4_ = auVar204._12_4_ * auVar99._12_4_;
                auVar99 = vhaddps_avx(auVar187,auVar187);
                fVar125 = fVar125 - auVar126._0_4_;
                fVar292 = fVar292 - auVar99._0_4_;
                auVar99 = vandps_avx(auVar181,local_9e0);
                bVar55 = true;
                if ((float)local_a60._0_4_ <= auVar99._0_4_) {
LAB_016ecd88:
                  auVar250 = local_aa0._0_28_;
                }
                else {
                  auVar92 = vfmadd231ss_fma(ZEXT416((uint)((float)local_a60._0_4_ + auVar92._0_4_)),
                                            local_800,ZEXT416(0x36000000));
                  auVar99 = vandps_avx(auVar133,local_9e0);
                  if (auVar92._0_4_ <= auVar99._0_4_) goto LAB_016ecd88;
                  fVar292 = fVar292 + (float)local_8f0._0_4_;
                  if ((fVar292 < fVar122) ||
                     (fVar89 = *(float *)(ray + k * 4 + 0x100), fVar89 < fVar292)) {
                    bVar55 = false;
                    unaff_BL = 0;
                    goto LAB_016ecd88;
                  }
                  bVar55 = false;
                  if (fVar125 < 0.0) {
                    unaff_BL = 0;
                    goto LAB_016ecd88;
                  }
                  if (1.0 < fVar125) {
                    unaff_BL = 0;
                    goto LAB_016ecd88;
                  }
                  auVar99 = vrsqrtss_avx(local_a20,local_a20);
                  fVar159 = auVar99._0_4_;
                  pGVar2 = (context->scene->geometries).items[uVar78].ptr;
                  if ((pGVar2->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                    unaff_BL = 0;
LAB_016ece45:
                    bVar55 = false;
                    goto LAB_016ecd88;
                  }
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar2->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                    unaff_BL = 1;
                    goto LAB_016ece45;
                  }
                  fVar159 = fVar159 * 1.5 + local_a20._0_4_ * -0.5 * fVar159 * fVar159 * fVar159;
                  auVar134._0_4_ = fVar159 * (float)local_940._0_4_;
                  auVar134._4_4_ = fVar159 * (float)local_940._4_4_;
                  auVar134._8_4_ = fVar159 * fStack_938;
                  auVar134._12_4_ = fVar159 * fStack_934;
                  auVar181 = vfmadd213ps_fma(auVar91,auVar134,auVar241);
                  auVar99 = vshufps_avx(auVar134,auVar134,0xc9);
                  auVar92 = vshufps_avx(auVar241,auVar241,0xc9);
                  auVar135._0_4_ = auVar134._0_4_ * auVar92._0_4_;
                  auVar135._4_4_ = auVar134._4_4_ * auVar92._4_4_;
                  auVar135._8_4_ = auVar134._8_4_ * auVar92._8_4_;
                  auVar135._12_4_ = auVar134._12_4_ * auVar92._12_4_;
                  auVar126 = vfmsub231ps_fma(auVar135,auVar241,auVar99);
                  auVar99 = vshufps_avx(auVar126,auVar126,0xc9);
                  auVar92 = vshufps_avx(auVar181,auVar181,0xc9);
                  auVar126 = vshufps_avx(auVar126,auVar126,0xd2);
                  auVar97._0_4_ = auVar181._0_4_ * auVar126._0_4_;
                  auVar97._4_4_ = auVar181._4_4_ * auVar126._4_4_;
                  auVar97._8_4_ = auVar181._8_4_ * auVar126._8_4_;
                  auVar97._12_4_ = auVar181._12_4_ * auVar126._12_4_;
                  auVar92 = vfmsub231ps_fma(auVar97,auVar99,auVar92);
                  auVar99 = vmovshdup_avx(auVar92);
                  auVar169._0_8_ = auVar99._0_8_;
                  auVar169._8_8_ = auVar169._0_8_;
                  auVar169._16_8_ = auVar169._0_8_;
                  auVar169._24_8_ = auVar169._0_8_;
                  auVar99 = vshufps_avx(auVar92,auVar92,0xaa);
                  local_460 = auVar99._0_8_;
                  local_440 = auVar92._0_4_;
                  local_480[0] = (RTCHitN)(char)auVar169._0_8_;
                  local_480[1] = (RTCHitN)(char)((ulong)auVar169._0_8_ >> 8);
                  local_480[2] = (RTCHitN)(char)((ulong)auVar169._0_8_ >> 0x10);
                  local_480[3] = (RTCHitN)(char)((ulong)auVar169._0_8_ >> 0x18);
                  local_480[4] = (RTCHitN)(char)((ulong)auVar169._0_8_ >> 0x20);
                  local_480[5] = (RTCHitN)(char)((ulong)auVar169._0_8_ >> 0x28);
                  local_480[6] = (RTCHitN)(char)((ulong)auVar169._0_8_ >> 0x30);
                  local_480[7] = (RTCHitN)(char)((ulong)auVar169._0_8_ >> 0x38);
                  local_480[8] = (RTCHitN)(char)auVar169._0_8_;
                  local_480[9] = (RTCHitN)(char)((ulong)auVar169._0_8_ >> 8);
                  local_480[10] = (RTCHitN)(char)((ulong)auVar169._0_8_ >> 0x10);
                  local_480[0xb] = (RTCHitN)(char)((ulong)auVar169._0_8_ >> 0x18);
                  local_480[0xc] = (RTCHitN)(char)((ulong)auVar169._0_8_ >> 0x20);
                  local_480[0xd] = (RTCHitN)(char)((ulong)auVar169._0_8_ >> 0x28);
                  local_480[0xe] = (RTCHitN)(char)((ulong)auVar169._0_8_ >> 0x30);
                  local_480[0xf] = (RTCHitN)(char)((ulong)auVar169._0_8_ >> 0x38);
                  local_480[0x10] = (RTCHitN)(char)auVar169._0_8_;
                  local_480[0x11] = (RTCHitN)(char)((ulong)auVar169._0_8_ >> 8);
                  local_480[0x12] = (RTCHitN)(char)((ulong)auVar169._0_8_ >> 0x10);
                  local_480[0x13] = (RTCHitN)(char)((ulong)auVar169._0_8_ >> 0x18);
                  local_480[0x14] = (RTCHitN)(char)((ulong)auVar169._0_8_ >> 0x20);
                  local_480[0x15] = (RTCHitN)(char)((ulong)auVar169._0_8_ >> 0x28);
                  local_480[0x16] = (RTCHitN)(char)((ulong)auVar169._0_8_ >> 0x30);
                  local_480[0x17] = (RTCHitN)(char)((ulong)auVar169._0_8_ >> 0x38);
                  local_480[0x18] = (RTCHitN)(char)auVar169._0_8_;
                  local_480[0x19] = (RTCHitN)(char)((ulong)auVar169._0_8_ >> 8);
                  local_480[0x1a] = (RTCHitN)(char)((ulong)auVar169._0_8_ >> 0x10);
                  local_480[0x1b] = (RTCHitN)(char)((ulong)auVar169._0_8_ >> 0x18);
                  local_480[0x1c] = (RTCHitN)(char)((ulong)auVar169._0_8_ >> 0x20);
                  local_480[0x1d] = (RTCHitN)(char)((ulong)auVar169._0_8_ >> 0x28);
                  local_480[0x1e] = (RTCHitN)(char)((ulong)auVar169._0_8_ >> 0x30);
                  local_480[0x1f] = (RTCHitN)(char)((ulong)auVar169._0_8_ >> 0x38);
                  uStack_458 = local_460;
                  uStack_450 = local_460;
                  uStack_448 = local_460;
                  uStack_43c = local_440;
                  uStack_438 = local_440;
                  uStack_434 = local_440;
                  uStack_430 = local_440;
                  uStack_42c = local_440;
                  uStack_428 = local_440;
                  uStack_424 = local_440;
                  local_420 = fVar125;
                  fStack_41c = fVar125;
                  fStack_418 = fVar125;
                  fStack_414 = fVar125;
                  fStack_410 = fVar125;
                  fStack_40c = fVar125;
                  fStack_408 = fVar125;
                  fStack_404 = fVar125;
                  local_400 = ZEXT432(0) << 0x20;
                  local_3e0 = CONCAT44(uStack_57c,local_580);
                  uStack_3d8 = CONCAT44(uStack_574,uStack_578);
                  uStack_3d0 = CONCAT44(uStack_56c,uStack_570);
                  uStack_3c8 = CONCAT44(uStack_564,uStack_568);
                  local_3c0 = CONCAT44(uStack_55c,local_560);
                  uStack_3b8 = CONCAT44(uStack_554,uStack_558);
                  uStack_3b0 = CONCAT44(uStack_54c,uStack_550);
                  uStack_3a8 = CONCAT44(uStack_544,uStack_548);
                  auVar114 = vpcmpeqd_avx2(auVar169,auVar169);
                  local_3a0 = context->user->instID[0];
                  uStack_39c = local_3a0;
                  uStack_398 = local_3a0;
                  uStack_394 = local_3a0;
                  uStack_390 = local_3a0;
                  uStack_38c = local_3a0;
                  uStack_388 = local_3a0;
                  uStack_384 = local_3a0;
                  local_380 = context->user->instPrimID[0];
                  uStack_37c = local_380;
                  uStack_378 = local_380;
                  uStack_374 = local_380;
                  uStack_370 = local_380;
                  uStack_36c = local_380;
                  uStack_368 = local_380;
                  uStack_364 = local_380;
                  *(float *)(ray + k * 4 + 0x100) = fVar292;
                  local_920 = local_5a0._0_8_;
                  uStack_918 = local_5a0._8_8_;
                  uStack_910 = local_5a0._16_8_;
                  uStack_908 = local_5a0._24_8_;
                  local_ad0.valid = (int *)&local_920;
                  local_ad0.geometryUserPtr = pGVar2->userPtr;
                  local_ad0.context = context->user;
                  local_ad0.hit = local_480;
                  local_ad0.N = 8;
                  local_ad0.ray = (RTCRayN *)ray;
                  if (pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar114 = ZEXT1632(auVar114._0_16_);
                    auVar269 = ZEXT1664(auVar269._0_16_);
                    (*pGVar2->occlusionFilterN)(&local_ad0);
                    auVar114 = vpcmpeqd_avx2(auVar114,auVar114);
                  }
                  auVar250 = local_aa0._0_28_;
                  auVar65._8_8_ = uStack_918;
                  auVar65._0_8_ = local_920;
                  auVar65._16_8_ = uStack_910;
                  auVar65._24_8_ = uStack_908;
                  auVar107 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar65);
                  auVar265 = auVar114 & ~auVar107;
                  if ((((((((auVar265 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar265 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar265 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar265 >> 0x7f,0) == '\0') &&
                        (auVar265 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar265 >> 0xbf,0) == '\0') &&
                      (auVar265 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar265[0x1f]) {
                    auVar107 = auVar107 ^ auVar114;
                  }
                  else {
                    p_Var3 = context->args->filter;
                    if ((p_Var3 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar2->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar114 = ZEXT1632(auVar114._0_16_);
                      auVar269 = ZEXT1664(auVar269._0_16_);
                      (*p_Var3)(&local_ad0);
                      auVar250 = local_aa0._0_28_;
                      auVar114 = vpcmpeqd_avx2(auVar114,auVar114);
                    }
                    auVar66._8_8_ = uStack_918;
                    auVar66._0_8_ = local_920;
                    auVar66._16_8_ = uStack_910;
                    auVar66._24_8_ = uStack_908;
                    auVar265 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar66);
                    auVar107 = auVar265 ^ auVar114;
                    auVar170._8_4_ = 0xff800000;
                    auVar170._0_8_ = 0xff800000ff800000;
                    auVar170._12_4_ = 0xff800000;
                    auVar170._16_4_ = 0xff800000;
                    auVar170._20_4_ = 0xff800000;
                    auVar170._24_4_ = 0xff800000;
                    auVar170._28_4_ = 0xff800000;
                    auVar114 = vblendvps_avx(auVar170,*(undefined1 (*) [32])(local_ad0.ray + 0x100),
                                             auVar265);
                    *(undefined1 (*) [32])(local_ad0.ray + 0x100) = auVar114;
                  }
                  bVar63 = (auVar107 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                  bVar64 = (auVar107 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                  bVar62 = (auVar107 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                  bVar61 = SUB321(auVar107 >> 0x7f,0) != '\0';
                  bVar59 = (auVar107 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
                  bVar58 = SUB321(auVar107 >> 0xbf,0) != '\0';
                  bVar57 = (auVar107 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
                  bVar55 = auVar107[0x1f] < '\0';
                  unaff_BL = ((((((bVar63 || bVar64) || bVar62) || bVar61) || bVar59) || bVar58) ||
                             bVar57) || bVar55;
                  if (((((((!bVar63 && !bVar64) && !bVar62) && !bVar61) && !bVar59) && !bVar58) &&
                      !bVar57) && !bVar55) {
                    *(float *)(ray + k * 4 + 0x100) = fVar89;
                  }
                  bVar55 = false;
                }
                if (!bVar55) goto LAB_016ed152;
                lVar82 = lVar82 + -1;
              } while (lVar82 != 0);
              unaff_BL = 0;
LAB_016ed152:
              unaff_BL = unaff_BL & 1;
              uVar84 = CONCAT71(local_820._1_7_,local_820[0] | unaff_BL);
              uVar85 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar115._4_4_ = uVar85;
              auVar115._0_4_ = uVar85;
              auVar115._8_4_ = uVar85;
              auVar115._12_4_ = uVar85;
              auVar115._16_4_ = uVar85;
              auVar115._20_4_ = uVar85;
              auVar115._24_4_ = uVar85;
              auVar115._28_4_ = uVar85;
              auVar265 = vcmpps_avx(_local_840,auVar115,2);
              auVar114 = vandps_avx(auVar265,local_720);
              auVar238 = ZEXT3264(auVar114);
              auVar265 = local_720 & auVar265;
              uVar81 = local_760;
              local_720 = auVar114;
            } while ((((((((auVar265 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar265 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar265 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar265 >> 0x7f,0) != '\0') ||
                       (auVar265 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar265 >> 0xbf,0) != '\0') ||
                     (auVar265 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar265[0x1f] < '\0');
          }
          auVar120._0_4_ = auVar250._0_4_ * (float)local_8c0._0_4_;
          auVar120._4_4_ = auVar250._4_4_ * (float)local_8c0._4_4_;
          auVar120._8_4_ = auVar250._8_4_ * fStack_8b8;
          auVar120._12_4_ = auVar250._12_4_ * fStack_8b4;
          auVar120._16_4_ = auVar250._16_4_ * fStack_8b0;
          auVar120._20_4_ = auVar250._20_4_ * fStack_8ac;
          auVar120._28_36_ = auVar238._28_36_;
          auVar120._24_4_ = auVar250._24_4_ * fStack_8a8;
          auVar99 = vfmadd213ps_fma(local_8a0,_local_9a0,auVar120._0_32_);
          auVar99 = vfmadd213ps_fma(_local_880,auVar229,ZEXT1632(auVar99));
          auVar73._4_4_ = uStack_85c;
          auVar73._0_4_ = local_860;
          auVar73._8_4_ = uStack_858;
          auVar73._12_4_ = uStack_854;
          auVar73._16_4_ = uStack_850;
          auVar73._20_4_ = uStack_84c;
          auVar73._24_4_ = uStack_848;
          auVar73._28_4_ = uStack_844;
          auVar114 = vandps_avx(ZEXT1632(auVar99),auVar73);
          auVar148._8_4_ = 0x3e99999a;
          auVar148._0_8_ = 0x3e99999a3e99999a;
          auVar148._12_4_ = 0x3e99999a;
          auVar148._16_4_ = 0x3e99999a;
          auVar148._20_4_ = 0x3e99999a;
          auVar148._24_4_ = 0x3e99999a;
          auVar148._28_4_ = 0x3e99999a;
          auVar114 = vcmpps_avx(auVar114,auVar148,1);
          auVar265 = vorps_avx(auVar114,local_6c0);
          auVar149._0_4_ = (float)local_980._0_4_ + (float)local_680._0_4_;
          auVar149._4_4_ = (float)local_980._4_4_ + (float)local_680._4_4_;
          auVar149._8_4_ = fStack_978 + fStack_678;
          auVar149._12_4_ = fStack_974 + fStack_674;
          auVar149._16_4_ = fStack_970 + fStack_670;
          auVar149._20_4_ = fStack_96c + fStack_66c;
          auVar149._24_4_ = fStack_968 + fStack_668;
          auVar149._28_4_ = fStack_964 + fStack_664;
          uVar85 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar171._4_4_ = uVar85;
          auVar171._0_4_ = uVar85;
          auVar171._8_4_ = uVar85;
          auVar171._12_4_ = uVar85;
          auVar171._16_4_ = uVar85;
          auVar171._20_4_ = uVar85;
          auVar171._24_4_ = uVar85;
          auVar171._28_4_ = uVar85;
          auVar114 = vcmpps_avx(auVar149,auVar171,2);
          local_8a0 = vandps_avx(auVar114,local_6a0);
          auVar150._8_4_ = 3;
          auVar150._0_8_ = 0x300000003;
          auVar150._12_4_ = 3;
          auVar150._16_4_ = 3;
          auVar150._20_4_ = 3;
          auVar150._24_4_ = 3;
          auVar150._28_4_ = 3;
          auVar172._8_4_ = 2;
          auVar172._0_8_ = 0x200000002;
          auVar172._12_4_ = 2;
          auVar172._16_4_ = 2;
          auVar172._20_4_ = 2;
          auVar172._24_4_ = 2;
          auVar172._28_4_ = 2;
          auVar114 = vblendvps_avx(auVar172,auVar150,auVar265);
          _local_8c0 = vpcmpgtd_avx2(auVar114,local_6e0);
          auVar114 = vpandn_avx2(_local_8c0,local_8a0);
          auVar265 = local_8a0 & ~_local_8c0;
          if ((((((((auVar265 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar265 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar265 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar265 >> 0x7f,0) == '\0') &&
                (auVar265 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar265 >> 0xbf,0) == '\0') &&
              (auVar265 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar265[0x1f]) {
            auVar238 = ZEXT3264(local_9c0);
            local_760 = uVar81;
          }
          else {
            auVar92 = vminps_avx(auVar9,auVar93);
            auVar99 = vmaxps_avx(auVar9,auVar93);
            auVar126 = vminps_avx(auVar94,auVar160);
            auVar181 = vminps_avx(auVar92,auVar126);
            auVar92 = vmaxps_avx(auVar94,auVar160);
            auVar126 = vmaxps_avx(auVar99,auVar92);
            auVar99 = vandps_avx(auVar181,local_9e0);
            auVar92 = vandps_avx(auVar126,local_9e0);
            auVar99 = vmaxps_avx(auVar99,auVar92);
            auVar92 = vmovshdup_avx(auVar99);
            auVar92 = vmaxss_avx(auVar92,auVar99);
            auVar99 = vshufpd_avx(auVar99,auVar99,1);
            auVar99 = vmaxss_avx(auVar99,auVar92);
            local_a40._0_4_ = auVar99._0_4_ * 1.9073486e-06;
            local_800 = vshufps_avx(auVar126,auVar126,0xff);
            _local_840 = _local_360;
            local_880._4_4_ = (float)local_980._4_4_ + (float)local_360._4_4_;
            local_880._0_4_ = (float)local_980._0_4_ + (float)local_360._0_4_;
            fStack_878 = fStack_978 + fStack_358;
            fStack_874 = fStack_974 + fStack_354;
            fStack_870 = fStack_970 + fStack_350;
            fStack_86c = fStack_96c + fStack_34c;
            fStack_868 = fStack_968 + fStack_348;
            fStack_864 = fStack_964 + fStack_344;
            do {
              auVar151._8_4_ = 0x7f800000;
              auVar151._0_8_ = 0x7f8000007f800000;
              auVar151._12_4_ = 0x7f800000;
              auVar151._16_4_ = 0x7f800000;
              auVar151._20_4_ = 0x7f800000;
              auVar151._24_4_ = 0x7f800000;
              auVar151._28_4_ = 0x7f800000;
              auVar265 = vblendvps_avx(auVar151,_local_840,auVar114);
              auVar107 = vshufps_avx(auVar265,auVar265,0xb1);
              auVar107 = vminps_avx(auVar265,auVar107);
              auVar12 = vshufpd_avx(auVar107,auVar107,5);
              auVar107 = vminps_avx(auVar107,auVar12);
              auVar12 = vpermpd_avx2(auVar107,0x4e);
              auVar107 = vminps_avx(auVar107,auVar12);
              auVar107 = vcmpps_avx(auVar265,auVar107,0);
              auVar12 = auVar114 & auVar107;
              auVar265 = auVar114;
              if ((((((((auVar12 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar12 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar12 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar12 >> 0x7f,0) != '\0') ||
                    (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar12 >> 0xbf,0) != '\0') ||
                  (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar12[0x1f] < '\0') {
                auVar265 = vandps_avx(auVar107,auVar114);
              }
              local_820._0_8_ = uVar84;
              uVar80 = vmovmskps_avx(auVar265);
              iVar79 = 0;
              for (; (uVar80 & 1) == 0; uVar80 = uVar80 >> 1 | 0x80000000) {
                iVar79 = iVar79 + 1;
              }
              uVar80 = iVar79 << 2;
              local_740 = auVar114;
              *(undefined4 *)(local_740 + uVar80) = 0;
              fVar125 = *(float *)(local_600 + uVar80);
              fVar292 = *(float *)(local_340 + uVar80);
              fVar154 = auVar8._0_4_;
              if ((float)local_9f0._0_4_ < 0.0) {
                fVar154 = sqrtf((float)local_9f0._0_4_);
              }
              local_960._0_4_ = fVar154 * 1.9073486e-06;
              lVar82 = 5;
              do {
                fVar154 = 1.0 - fVar125;
                auVar136._0_4_ = fVar123 * fVar125;
                auVar136._4_4_ = auVar93._4_4_ * fVar125;
                auVar136._8_4_ = auVar93._8_4_ * fVar125;
                auVar136._12_4_ = auVar93._12_4_ * fVar125;
                auVar163._4_4_ = fVar154;
                auVar163._0_4_ = fVar154;
                auVar163._8_4_ = fVar154;
                auVar163._12_4_ = fVar154;
                auVar99 = vfmadd231ps_fma(auVar136,auVar163,auVar9);
                auVar188._0_4_ = fVar124 * fVar125;
                auVar188._4_4_ = auVar94._4_4_ * fVar125;
                auVar188._8_4_ = auVar94._8_4_ * fVar125;
                auVar188._12_4_ = auVar94._12_4_ * fVar125;
                auVar92 = vfmadd231ps_fma(auVar188,auVar163,auVar93);
                auVar227._0_4_ = fVar125 * auVar92._0_4_;
                auVar227._4_4_ = fVar125 * auVar92._4_4_;
                auVar227._8_4_ = fVar125 * auVar92._8_4_;
                auVar227._12_4_ = fVar125 * auVar92._12_4_;
                auVar126 = vfmadd231ps_fma(auVar227,auVar163,auVar99);
                auVar137._0_4_ = fVar125 * fVar180;
                auVar137._4_4_ = fVar125 * fStack_b7c;
                auVar137._8_4_ = fVar125 * fStack_b78;
                auVar137._12_4_ = fVar125 * fStack_b74;
                auVar99 = vfmadd231ps_fma(auVar137,auVar163,auVar94);
                auVar207._0_4_ = fVar125 * auVar99._0_4_;
                auVar207._4_4_ = fVar125 * auVar99._4_4_;
                auVar207._8_4_ = fVar125 * auVar99._8_4_;
                auVar207._12_4_ = fVar125 * auVar99._12_4_;
                auVar92 = vfmadd231ps_fma(auVar207,auVar163,auVar92);
                auVar138._4_4_ = fVar292;
                auVar138._0_4_ = fVar292;
                auVar138._8_4_ = fVar292;
                auVar138._12_4_ = fVar292;
                auVar99 = vfmadd213ps_fma(auVar138,local_9d0,_DAT_01feba10);
                auVar98._0_4_ = fVar125 * auVar92._0_4_;
                auVar98._4_4_ = fVar125 * auVar92._4_4_;
                auVar98._8_4_ = fVar125 * auVar92._8_4_;
                auVar98._12_4_ = fVar125 * auVar92._12_4_;
                auVar181 = vfmadd231ps_fma(auVar98,auVar126,auVar163);
                local_780._0_16_ = auVar181;
                auVar99 = vsubps_avx(auVar99,auVar181);
                _local_940 = auVar99;
                auVar99 = vdpps_avx(auVar99,auVar99,0x7f);
                local_a20 = auVar99;
                if (auVar99._0_4_ < 0.0) {
                  auVar121._0_4_ = sqrtf(auVar99._0_4_);
                  auVar121._4_60_ = extraout_var_00;
                  auVar99 = auVar121._0_16_;
                }
                else {
                  auVar99 = vsqrtss_avx(auVar99,auVar99);
                }
                auVar92 = vsubps_avx(auVar92,auVar126);
                auVar242._0_4_ = auVar92._0_4_ * 3.0;
                auVar242._4_4_ = auVar92._4_4_ * 3.0;
                auVar242._8_4_ = auVar92._8_4_ * 3.0;
                auVar242._12_4_ = auVar92._12_4_ * 3.0;
                auVar92 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),ZEXT416((uint)fVar154),
                                          ZEXT416((uint)fVar125));
                auVar126 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),ZEXT416((uint)fVar125),
                                           ZEXT416((uint)fVar154));
                fVar154 = fVar154 * 6.0;
                fVar89 = auVar92._0_4_ * 6.0;
                fVar159 = auVar126._0_4_ * 6.0;
                fVar155 = fVar125 * 6.0;
                auVar189._0_4_ = fVar155 * fVar180;
                auVar189._4_4_ = fVar155 * fStack_b7c;
                auVar189._8_4_ = fVar155 * fStack_b78;
                auVar189._12_4_ = fVar155 * fStack_b74;
                auVar139._4_4_ = fVar159;
                auVar139._0_4_ = fVar159;
                auVar139._8_4_ = fVar159;
                auVar139._12_4_ = fVar159;
                auVar92 = vfmadd132ps_fma(auVar139,auVar189,auVar94);
                auVar190._4_4_ = fVar89;
                auVar190._0_4_ = fVar89;
                auVar190._8_4_ = fVar89;
                auVar190._12_4_ = fVar89;
                auVar92 = vfmadd132ps_fma(auVar190,auVar92,auVar93);
                auVar126 = vdpps_avx(auVar242,auVar242,0x7f);
                auVar140._4_4_ = fVar154;
                auVar140._0_4_ = fVar154;
                auVar140._8_4_ = fVar154;
                auVar140._12_4_ = fVar154;
                auVar204 = vfmadd132ps_fma(auVar140,auVar92,auVar9);
                auVar92 = vblendps_avx(auVar126,_DAT_01feba10,0xe);
                auVar181 = vrsqrtss_avx(auVar92,auVar92);
                fVar159 = auVar126._0_4_;
                fVar154 = auVar181._0_4_;
                auVar181 = vdpps_avx(auVar242,auVar204,0x7f);
                fVar154 = fVar154 * 1.5 + fVar159 * -0.5 * fVar154 * fVar154 * fVar154;
                auVar141._0_4_ = auVar204._0_4_ * fVar159;
                auVar141._4_4_ = auVar204._4_4_ * fVar159;
                auVar141._8_4_ = auVar204._8_4_ * fVar159;
                auVar141._12_4_ = auVar204._12_4_ * fVar159;
                fVar89 = auVar181._0_4_;
                auVar228._0_4_ = auVar242._0_4_ * fVar89;
                auVar228._4_4_ = auVar242._4_4_ * fVar89;
                auVar228._8_4_ = auVar242._8_4_ * fVar89;
                auVar228._12_4_ = auVar242._12_4_ * fVar89;
                auVar181 = vsubps_avx(auVar141,auVar228);
                auVar92 = vrcpss_avx(auVar92,auVar92);
                auVar204 = vfnmadd213ss_fma(auVar92,auVar126,ZEXT416(0x40000000));
                fVar89 = auVar92._0_4_ * auVar204._0_4_;
                auVar92 = vmaxss_avx(ZEXT416((uint)local_a40._0_4_),
                                     ZEXT416((uint)(fVar292 * (float)local_960._0_4_)));
                uVar81 = CONCAT44(auVar242._4_4_,auVar242._0_4_);
                auVar263._0_8_ = uVar81 ^ 0x8000000080000000;
                auVar263._8_4_ = -auVar242._8_4_;
                auVar263._12_4_ = -auVar242._12_4_;
                auVar191._0_4_ = fVar154 * auVar181._0_4_ * fVar89;
                auVar191._4_4_ = fVar154 * auVar181._4_4_ * fVar89;
                auVar191._8_4_ = fVar154 * auVar181._8_4_ * fVar89;
                auVar191._12_4_ = fVar154 * auVar181._12_4_ * fVar89;
                local_a80._0_4_ = auVar242._0_4_ * fVar154;
                local_a80._4_4_ = auVar242._4_4_ * fVar154;
                local_a80._8_4_ = auVar242._8_4_ * fVar154;
                local_a80._12_4_ = auVar242._12_4_ * fVar154;
                if (fVar159 < -fVar159) {
                  local_a60._0_16_ = auVar263;
                  fVar154 = sqrtf(fVar159);
                  auVar99 = ZEXT416(auVar99._0_4_);
                  auVar263 = local_a60._0_16_;
                }
                else {
                  auVar126 = vsqrtss_avx(auVar126,auVar126);
                  fVar154 = auVar126._0_4_;
                }
                auVar126 = vdpps_avx(_local_940,local_a80._0_16_,0x7f);
                auVar133 = vfmadd213ss_fma(ZEXT416((uint)local_a40._0_4_),auVar99,
                                           ZEXT416((uint)auVar92._0_4_));
                auVar181 = vdpps_avx(auVar263,local_a80._0_16_,0x7f);
                auVar204 = vdpps_avx(_local_940,auVar191,0x7f);
                auVar91 = vdpps_avx(local_9d0,local_a80._0_16_,0x7f);
                auVar99 = vfmadd213ss_fma(ZEXT416((uint)(auVar99._0_4_ + 1.0)),
                                          ZEXT416((uint)((float)local_a40._0_4_ / fVar154)),auVar133
                                         );
                local_a60._0_4_ = auVar99._0_4_;
                auVar100._0_4_ = auVar126._0_4_ * auVar126._0_4_;
                auVar100._4_4_ = auVar126._4_4_ * auVar126._4_4_;
                auVar100._8_4_ = auVar126._8_4_ * auVar126._8_4_;
                auVar100._12_4_ = auVar126._12_4_ * auVar126._12_4_;
                auVar99 = vdpps_avx(_local_940,auVar263,0x7f);
                auVar164 = vsubps_avx(local_a20,auVar100);
                auVar133 = vrsqrtss_avx(auVar164,auVar164);
                fVar89 = auVar164._0_4_;
                fVar154 = auVar133._0_4_;
                fVar154 = fVar154 * 1.5 + fVar89 * -0.5 * fVar154 * fVar154 * fVar154;
                auVar133 = vdpps_avx(_local_940,local_9d0,0x7f);
                local_a80._0_16_ = ZEXT416((uint)(auVar181._0_4_ + auVar204._0_4_));
                auVar99 = vfnmadd231ss_fma(auVar99,auVar126,local_a80._0_16_);
                auVar181 = vfnmadd231ss_fma(auVar133,auVar126,auVar91);
                if (fVar89 < 0.0) {
                  local_7a0._0_16_ = auVar99;
                  local_7c0._0_4_ = fVar154;
                  local_7e0._0_16_ = auVar181;
                  fVar89 = sqrtf(fVar89);
                  fVar154 = (float)local_7c0._0_4_;
                  auVar181 = local_7e0._0_16_;
                  auVar99 = local_7a0._0_16_;
                }
                else {
                  auVar204 = vsqrtss_avx(auVar164,auVar164);
                  fVar89 = auVar204._0_4_;
                }
                auVar204 = vpermilps_avx(local_780._0_16_,0xff);
                auVar133 = vpermilps_avx(auVar242,0xff);
                auVar99 = vfmsub213ss_fma(auVar99,ZEXT416((uint)fVar154),auVar133);
                auVar192._0_8_ = auVar91._0_8_ ^ 0x8000000080000000;
                auVar192._8_4_ = auVar91._8_4_ ^ 0x80000000;
                auVar192._12_4_ = auVar91._12_4_ ^ 0x80000000;
                auVar208._0_8_ = auVar99._0_8_ ^ 0x8000000080000000;
                auVar208._8_4_ = auVar99._8_4_ ^ 0x80000000;
                auVar208._12_4_ = auVar99._12_4_ ^ 0x80000000;
                auVar269 = ZEXT1664(local_a80._0_16_);
                auVar164 = ZEXT416((uint)(auVar181._0_4_ * fVar154));
                auVar181 = vfmsub231ss_fma(ZEXT416((uint)(auVar91._0_4_ * auVar99._0_4_)),
                                           local_a80._0_16_,auVar164);
                auVar99 = vinsertps_avx(auVar164,auVar192,0x10);
                uVar85 = auVar181._0_4_;
                auVar193._4_4_ = uVar85;
                auVar193._0_4_ = uVar85;
                auVar193._8_4_ = uVar85;
                auVar193._12_4_ = uVar85;
                auVar99 = vdivps_avx(auVar99,auVar193);
                auVar91 = ZEXT416((uint)(fVar89 - auVar204._0_4_));
                auVar204 = vinsertps_avx(auVar126,auVar91,0x10);
                auVar165._0_4_ = auVar204._0_4_ * auVar99._0_4_;
                auVar165._4_4_ = auVar204._4_4_ * auVar99._4_4_;
                auVar165._8_4_ = auVar204._8_4_ * auVar99._8_4_;
                auVar165._12_4_ = auVar204._12_4_ * auVar99._12_4_;
                auVar99 = vinsertps_avx(auVar208,local_a80._0_16_,0x1c);
                auVar99 = vdivps_avx(auVar99,auVar193);
                auVar181 = vhaddps_avx(auVar165,auVar165);
                auVar194._0_4_ = auVar204._0_4_ * auVar99._0_4_;
                auVar194._4_4_ = auVar204._4_4_ * auVar99._4_4_;
                auVar194._8_4_ = auVar204._8_4_ * auVar99._8_4_;
                auVar194._12_4_ = auVar204._12_4_ * auVar99._12_4_;
                auVar99 = vhaddps_avx(auVar194,auVar194);
                fVar125 = fVar125 - auVar181._0_4_;
                fVar292 = fVar292 - auVar99._0_4_;
                auVar99 = vandps_avx(auVar126,local_9e0);
                bVar55 = true;
                if ((float)local_a60._0_4_ <= auVar99._0_4_) {
                  auVar238 = ZEXT3264(local_9c0);
                }
                else {
                  auVar92 = vfmadd231ss_fma(ZEXT416((uint)((float)local_a60._0_4_ + auVar92._0_4_)),
                                            local_800,ZEXT416(0x36000000));
                  auVar99 = vandps_avx(auVar91,local_9e0);
                  auVar238 = ZEXT3264(local_9c0);
                  if (auVar99._0_4_ < auVar92._0_4_) {
                    fVar292 = fVar292 + (float)local_8f0._0_4_;
                    if ((((fVar122 <= fVar292) &&
                         (fVar154 = *(float *)(ray + k * 4 + 0x100), fVar292 <= fVar154)) &&
                        (0.0 <= fVar125)) && (fVar125 <= 1.0)) {
                      auVar99 = vrsqrtss_avx(local_a20,local_a20);
                      fVar89 = auVar99._0_4_;
                      pGVar2 = (context->scene->geometries).items[uVar78].ptr;
                      if ((pGVar2->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar2->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                          unaff_BL = true;
                        }
                        else {
                          fVar89 = fVar89 * 1.5 + local_a20._0_4_ * -0.5 * fVar89 * fVar89 * fVar89;
                          auVar142._0_4_ = fVar89 * (float)local_940._0_4_;
                          auVar142._4_4_ = fVar89 * (float)local_940._4_4_;
                          auVar142._8_4_ = fVar89 * fStack_938;
                          auVar142._12_4_ = fVar89 * fStack_934;
                          auVar181 = vfmadd213ps_fma(auVar133,auVar142,auVar242);
                          auVar99 = vshufps_avx(auVar142,auVar142,0xc9);
                          auVar92 = vshufps_avx(auVar242,auVar242,0xc9);
                          auVar143._0_4_ = auVar142._0_4_ * auVar92._0_4_;
                          auVar143._4_4_ = auVar142._4_4_ * auVar92._4_4_;
                          auVar143._8_4_ = auVar142._8_4_ * auVar92._8_4_;
                          auVar143._12_4_ = auVar142._12_4_ * auVar92._12_4_;
                          auVar126 = vfmsub231ps_fma(auVar143,auVar242,auVar99);
                          auVar99 = vshufps_avx(auVar126,auVar126,0xc9);
                          auVar92 = vshufps_avx(auVar181,auVar181,0xc9);
                          auVar126 = vshufps_avx(auVar126,auVar126,0xd2);
                          auVar101._0_4_ = auVar181._0_4_ * auVar126._0_4_;
                          auVar101._4_4_ = auVar181._4_4_ * auVar126._4_4_;
                          auVar101._8_4_ = auVar181._8_4_ * auVar126._8_4_;
                          auVar101._12_4_ = auVar181._12_4_ * auVar126._12_4_;
                          auVar92 = vfmsub231ps_fma(auVar101,auVar99,auVar92);
                          auVar99 = vmovshdup_avx(auVar92);
                          auVar173._0_8_ = auVar99._0_8_;
                          auVar173._8_8_ = auVar173._0_8_;
                          auVar173._16_8_ = auVar173._0_8_;
                          auVar173._24_8_ = auVar173._0_8_;
                          auVar99 = vshufps_avx(auVar92,auVar92,0xaa);
                          local_460 = auVar99._0_8_;
                          local_440 = auVar92._0_4_;
                          local_480[0] = (RTCHitN)(char)auVar173._0_8_;
                          local_480[1] = (RTCHitN)(char)((ulong)auVar173._0_8_ >> 8);
                          local_480[2] = (RTCHitN)(char)((ulong)auVar173._0_8_ >> 0x10);
                          local_480[3] = (RTCHitN)(char)((ulong)auVar173._0_8_ >> 0x18);
                          local_480[4] = (RTCHitN)(char)((ulong)auVar173._0_8_ >> 0x20);
                          local_480[5] = (RTCHitN)(char)((ulong)auVar173._0_8_ >> 0x28);
                          local_480[6] = (RTCHitN)(char)((ulong)auVar173._0_8_ >> 0x30);
                          local_480[7] = (RTCHitN)(char)((ulong)auVar173._0_8_ >> 0x38);
                          local_480[8] = (RTCHitN)(char)auVar173._0_8_;
                          local_480[9] = (RTCHitN)(char)((ulong)auVar173._0_8_ >> 8);
                          local_480[10] = (RTCHitN)(char)((ulong)auVar173._0_8_ >> 0x10);
                          local_480[0xb] = (RTCHitN)(char)((ulong)auVar173._0_8_ >> 0x18);
                          local_480[0xc] = (RTCHitN)(char)((ulong)auVar173._0_8_ >> 0x20);
                          local_480[0xd] = (RTCHitN)(char)((ulong)auVar173._0_8_ >> 0x28);
                          local_480[0xe] = (RTCHitN)(char)((ulong)auVar173._0_8_ >> 0x30);
                          local_480[0xf] = (RTCHitN)(char)((ulong)auVar173._0_8_ >> 0x38);
                          local_480[0x10] = (RTCHitN)(char)auVar173._0_8_;
                          local_480[0x11] = (RTCHitN)(char)((ulong)auVar173._0_8_ >> 8);
                          local_480[0x12] = (RTCHitN)(char)((ulong)auVar173._0_8_ >> 0x10);
                          local_480[0x13] = (RTCHitN)(char)((ulong)auVar173._0_8_ >> 0x18);
                          local_480[0x14] = (RTCHitN)(char)((ulong)auVar173._0_8_ >> 0x20);
                          local_480[0x15] = (RTCHitN)(char)((ulong)auVar173._0_8_ >> 0x28);
                          local_480[0x16] = (RTCHitN)(char)((ulong)auVar173._0_8_ >> 0x30);
                          local_480[0x17] = (RTCHitN)(char)((ulong)auVar173._0_8_ >> 0x38);
                          local_480[0x18] = (RTCHitN)(char)auVar173._0_8_;
                          local_480[0x19] = (RTCHitN)(char)((ulong)auVar173._0_8_ >> 8);
                          local_480[0x1a] = (RTCHitN)(char)((ulong)auVar173._0_8_ >> 0x10);
                          local_480[0x1b] = (RTCHitN)(char)((ulong)auVar173._0_8_ >> 0x18);
                          local_480[0x1c] = (RTCHitN)(char)((ulong)auVar173._0_8_ >> 0x20);
                          local_480[0x1d] = (RTCHitN)(char)((ulong)auVar173._0_8_ >> 0x28);
                          local_480[0x1e] = (RTCHitN)(char)((ulong)auVar173._0_8_ >> 0x30);
                          local_480[0x1f] = (RTCHitN)(char)((ulong)auVar173._0_8_ >> 0x38);
                          uStack_458 = local_460;
                          uStack_450 = local_460;
                          uStack_448 = local_460;
                          uStack_43c = local_440;
                          uStack_438 = local_440;
                          uStack_434 = local_440;
                          uStack_430 = local_440;
                          uStack_42c = local_440;
                          uStack_428 = local_440;
                          uStack_424 = local_440;
                          local_420 = fVar125;
                          fStack_41c = fVar125;
                          fStack_418 = fVar125;
                          fStack_414 = fVar125;
                          fStack_410 = fVar125;
                          fStack_40c = fVar125;
                          fStack_408 = fVar125;
                          fStack_404 = fVar125;
                          local_400 = ZEXT432(0) << 0x20;
                          local_3e0 = CONCAT44(uStack_57c,local_580);
                          uStack_3d8 = CONCAT44(uStack_574,uStack_578);
                          uStack_3d0 = CONCAT44(uStack_56c,uStack_570);
                          uStack_3c8 = CONCAT44(uStack_564,uStack_568);
                          local_3c0 = CONCAT44(uStack_55c,local_560);
                          uStack_3b8 = CONCAT44(uStack_554,uStack_558);
                          uStack_3b0 = CONCAT44(uStack_54c,uStack_550);
                          uStack_3a8 = CONCAT44(uStack_544,uStack_548);
                          auVar114 = vpcmpeqd_avx2(auVar173,auVar173);
                          local_3a0 = context->user->instID[0];
                          uStack_39c = local_3a0;
                          uStack_398 = local_3a0;
                          uStack_394 = local_3a0;
                          uStack_390 = local_3a0;
                          uStack_38c = local_3a0;
                          uStack_388 = local_3a0;
                          uStack_384 = local_3a0;
                          local_380 = context->user->instPrimID[0];
                          uStack_37c = local_380;
                          uStack_378 = local_380;
                          uStack_374 = local_380;
                          uStack_370 = local_380;
                          uStack_36c = local_380;
                          uStack_368 = local_380;
                          uStack_364 = local_380;
                          *(float *)(ray + k * 4 + 0x100) = fVar292;
                          local_920 = local_5a0._0_8_;
                          uStack_918 = local_5a0._8_8_;
                          uStack_910 = local_5a0._16_8_;
                          uStack_908 = local_5a0._24_8_;
                          local_ad0.valid = (int *)&local_920;
                          local_ad0.geometryUserPtr = pGVar2->userPtr;
                          local_ad0.context = context->user;
                          local_ad0.hit = local_480;
                          local_ad0.N = 8;
                          local_ad0.ray = (RTCRayN *)ray;
                          if (pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                            auVar114 = ZEXT1632(auVar114._0_16_);
                            auVar269 = ZEXT1664(local_a80._0_16_);
                            (*pGVar2->occlusionFilterN)(&local_ad0);
                            auVar238 = ZEXT3264(local_9c0);
                            auVar114 = vpcmpeqd_avx2(auVar114,auVar114);
                          }
                          auVar67._8_8_ = uStack_918;
                          auVar67._0_8_ = local_920;
                          auVar67._16_8_ = uStack_910;
                          auVar67._24_8_ = uStack_908;
                          auVar107 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),
                                                   auVar67);
                          auVar265 = auVar114 & ~auVar107;
                          if ((((((((auVar265 >> 0x1f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0 &&
                                   (auVar265 >> 0x3f & (undefined1  [32])0x1) ==
                                   (undefined1  [32])0x0) &&
                                  (auVar265 >> 0x5f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) && SUB321(auVar265 >> 0x7f,0) == '\0') &&
                                (auVar265 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0)
                               && SUB321(auVar265 >> 0xbf,0) == '\0') &&
                              (auVar265 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0)
                              && -1 < auVar265[0x1f]) {
                            auVar107 = auVar107 ^ auVar114;
                          }
                          else {
                            p_Var3 = context->args->filter;
                            if ((p_Var3 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar2->field_8).field_0x2 & 0x40) != 0)))) {
                              auVar114 = ZEXT1632(auVar114._0_16_);
                              auVar269 = ZEXT1664(auVar269._0_16_);
                              (*p_Var3)(&local_ad0);
                              auVar238 = ZEXT3264(local_9c0);
                              auVar114 = vpcmpeqd_avx2(auVar114,auVar114);
                            }
                            auVar68._8_8_ = uStack_918;
                            auVar68._0_8_ = local_920;
                            auVar68._16_8_ = uStack_910;
                            auVar68._24_8_ = uStack_908;
                            auVar265 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),
                                                     auVar68);
                            auVar107 = auVar265 ^ auVar114;
                            auVar174._8_4_ = 0xff800000;
                            auVar174._0_8_ = 0xff800000ff800000;
                            auVar174._12_4_ = 0xff800000;
                            auVar174._16_4_ = 0xff800000;
                            auVar174._20_4_ = 0xff800000;
                            auVar174._24_4_ = 0xff800000;
                            auVar174._28_4_ = 0xff800000;
                            auVar114 = vblendvps_avx(auVar174,*(undefined1 (*) [32])
                                                               (local_ad0.ray + 0x100),auVar265);
                            *(undefined1 (*) [32])(local_ad0.ray + 0x100) = auVar114;
                          }
                          bVar63 = (auVar107 >> 0x1f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0;
                          bVar64 = (auVar107 >> 0x3f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0;
                          bVar62 = (auVar107 >> 0x5f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0;
                          bVar61 = SUB321(auVar107 >> 0x7f,0) != '\0';
                          bVar59 = (auVar107 & (undefined1  [32])0x100000000) !=
                                   (undefined1  [32])0x0;
                          bVar58 = SUB321(auVar107 >> 0xbf,0) != '\0';
                          bVar57 = (auVar107 & (undefined1  [32])0x100000000) !=
                                   (undefined1  [32])0x0;
                          bVar55 = auVar107[0x1f] < '\0';
                          unaff_BL = ((((((bVar63 || bVar64) || bVar62) || bVar61) || bVar59) ||
                                      bVar58) || bVar57) || bVar55;
                          if (((((((!bVar63 && !bVar64) && !bVar62) && !bVar61) && !bVar59) &&
                               !bVar58) && !bVar57) && !bVar55) {
                            *(float *)(ray + k * 4 + 0x100) = fVar154;
                          }
                        }
                        bVar55 = false;
                        goto LAB_016ed8c2;
                      }
                    }
                    bVar55 = false;
                    unaff_BL = 0;
                  }
                }
LAB_016ed8c2:
                if (!bVar55) goto LAB_016edc1c;
                lVar82 = lVar82 + -1;
              } while (lVar82 != 0);
              unaff_BL = 0;
LAB_016edc1c:
              unaff_BL = unaff_BL & 1;
              uVar84 = CONCAT71(local_820._1_7_,local_820[0] | unaff_BL);
              uVar85 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar116._4_4_ = uVar85;
              auVar116._0_4_ = uVar85;
              auVar116._8_4_ = uVar85;
              auVar116._12_4_ = uVar85;
              auVar116._16_4_ = uVar85;
              auVar116._20_4_ = uVar85;
              auVar116._24_4_ = uVar85;
              auVar116._28_4_ = uVar85;
              auVar265 = vcmpps_avx(_local_880,auVar116,2);
              auVar114 = vandps_avx(auVar265,local_740);
              local_740 = local_740 & auVar265;
            } while ((((((((local_740 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (local_740 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (local_740 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(local_740 >> 0x7f,0) != '\0') ||
                       (local_740 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(local_740 >> 0xbf,0) != '\0') ||
                     (local_740 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     local_740[0x1f] < '\0');
          }
          auVar152._0_4_ = (float)local_980._0_4_ + local_4c0._0_4_;
          auVar152._4_4_ = (float)local_980._4_4_ + local_4c0._4_4_;
          auVar152._8_4_ = fStack_978 + local_4c0._8_4_;
          auVar152._12_4_ = fStack_974 + local_4c0._12_4_;
          auVar152._16_4_ = fStack_970 + local_4c0._16_4_;
          auVar152._20_4_ = fStack_96c + local_4c0._20_4_;
          auVar152._24_4_ = fStack_968 + local_4c0._24_4_;
          auVar152._28_4_ = fStack_964 + local_4c0._28_4_;
          uVar85 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar201._4_4_ = uVar85;
          auVar201._0_4_ = uVar85;
          auVar201._8_4_ = uVar85;
          auVar201._12_4_ = uVar85;
          auVar201._16_4_ = uVar85;
          auVar201._20_4_ = uVar85;
          auVar201._24_4_ = uVar85;
          auVar201._28_4_ = uVar85;
          auVar265 = vcmpps_avx(auVar152,auVar201,2);
          auVar114 = vandps_avx(local_660,local_640);
          auVar114 = vandps_avx(auVar265,auVar114);
          auVar213._0_4_ = (float)local_980._0_4_ + local_360._0_4_;
          auVar213._4_4_ = (float)local_980._4_4_ + local_360._4_4_;
          auVar213._8_4_ = fStack_978 + local_360._8_4_;
          auVar213._12_4_ = fStack_974 + local_360._12_4_;
          auVar213._16_4_ = fStack_970 + local_360._16_4_;
          auVar213._20_4_ = fStack_96c + local_360._20_4_;
          auVar213._24_4_ = fStack_968 + local_360._24_4_;
          auVar213._28_4_ = fStack_964 + local_360._28_4_;
          auVar107 = vcmpps_avx(auVar213,auVar201,2);
          auVar265 = vandps_avx(_local_8c0,local_8a0);
          auVar265 = vandps_avx(auVar107,auVar265);
          auVar265 = vorps_avx(auVar114,auVar265);
          if ((((((((auVar265 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar265 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar265 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar265 >> 0x7f,0) != '\0') ||
                (auVar265 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar265 >> 0xbf,0) != '\0') ||
              (auVar265 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar265[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar86 * 0x60) = auVar265;
            auVar114 = vblendvps_avx(_local_360,local_4c0,auVar114);
            *(undefined1 (*) [32])(auStack_160 + uVar86 * 0x60) = auVar114;
            uVar90 = vmovlps_avx(local_8e0);
            *(undefined8 *)(afStack_140 + uVar86 * 0x18) = uVar90;
            auStack_138[uVar86 * 0x18] = (int)local_760 + 1;
            uVar86 = (ulong)((int)uVar86 + 1);
          }
        }
      }
    }
    do {
      auVar277 = ZEXT3264(auVar283);
      uVar80 = (uint)uVar86;
      if (uVar80 == 0) {
        if ((uVar84 & 1) != 0) {
          return local_cc9;
        }
        uVar88 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar102._4_4_ = uVar88;
        auVar102._0_4_ = uVar88;
        auVar102._8_4_ = uVar88;
        auVar102._12_4_ = uVar88;
        auVar4 = vcmpps_avx(local_5b0,auVar102,2);
        uVar78 = vmovmskps_avx(auVar4);
        uVar78 = (uint)local_8c8 & uVar78;
        local_cc9 = uVar78 != 0;
        if (!local_cc9) {
          return local_cc9;
        }
        goto LAB_016eb6c8;
      }
      uVar86 = (ulong)(uVar80 - 1);
      lVar82 = uVar86 * 0x60;
      auVar114 = *(undefined1 (*) [32])(auStack_160 + lVar82);
      auVar117._0_4_ = (float)local_980._0_4_ + auVar114._0_4_;
      auVar117._4_4_ = (float)local_980._4_4_ + auVar114._4_4_;
      auVar117._8_4_ = fStack_978 + auVar114._8_4_;
      auVar117._12_4_ = fStack_974 + auVar114._12_4_;
      auVar117._16_4_ = fStack_970 + auVar114._16_4_;
      auVar117._20_4_ = fStack_96c + auVar114._20_4_;
      auVar117._24_4_ = fStack_968 + auVar114._24_4_;
      auVar117._28_4_ = fStack_964 + auVar114._28_4_;
      uVar85 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar202._4_4_ = uVar85;
      auVar202._0_4_ = uVar85;
      auVar202._8_4_ = uVar85;
      auVar202._12_4_ = uVar85;
      auVar202._16_4_ = uVar85;
      auVar202._20_4_ = uVar85;
      auVar202._24_4_ = uVar85;
      auVar202._28_4_ = uVar85;
      auVar107 = vcmpps_avx(auVar117,auVar202,2);
      auVar265 = vandps_avx(auVar107,*(undefined1 (*) [32])(auStack_180 + lVar82));
      local_480[0] = (RTCHitN)auVar265[0];
      local_480[1] = (RTCHitN)auVar265[1];
      local_480[2] = (RTCHitN)auVar265[2];
      local_480[3] = (RTCHitN)auVar265[3];
      local_480[4] = (RTCHitN)auVar265[4];
      local_480[5] = (RTCHitN)auVar265[5];
      local_480[6] = (RTCHitN)auVar265[6];
      local_480[7] = (RTCHitN)auVar265[7];
      local_480[8] = (RTCHitN)auVar265[8];
      local_480[9] = (RTCHitN)auVar265[9];
      local_480[10] = (RTCHitN)auVar265[10];
      local_480[0xb] = (RTCHitN)auVar265[0xb];
      local_480[0xc] = (RTCHitN)auVar265[0xc];
      local_480[0xd] = (RTCHitN)auVar265[0xd];
      local_480[0xe] = (RTCHitN)auVar265[0xe];
      local_480[0xf] = (RTCHitN)auVar265[0xf];
      local_480[0x10] = (RTCHitN)auVar265[0x10];
      local_480[0x11] = (RTCHitN)auVar265[0x11];
      local_480[0x12] = (RTCHitN)auVar265[0x12];
      local_480[0x13] = (RTCHitN)auVar265[0x13];
      local_480[0x14] = (RTCHitN)auVar265[0x14];
      local_480[0x15] = (RTCHitN)auVar265[0x15];
      local_480[0x16] = (RTCHitN)auVar265[0x16];
      local_480[0x17] = (RTCHitN)auVar265[0x17];
      local_480[0x18] = (RTCHitN)auVar265[0x18];
      local_480[0x19] = (RTCHitN)auVar265[0x19];
      local_480[0x1a] = (RTCHitN)auVar265[0x1a];
      local_480[0x1b] = (RTCHitN)auVar265[0x1b];
      local_480[0x1c] = (RTCHitN)auVar265[0x1c];
      local_480[0x1d] = (RTCHitN)auVar265[0x1d];
      local_480[0x1e] = (RTCHitN)auVar265[0x1e];
      local_480[0x1f] = (RTCHitN)auVar265[0x1f];
      auVar107 = *(undefined1 (*) [32])(auStack_180 + lVar82) & auVar107;
      bVar63 = (auVar107 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar64 = (auVar107 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar62 = (auVar107 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar61 = SUB321(auVar107 >> 0x7f,0) == '\0';
      bVar59 = (auVar107 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar58 = SUB321(auVar107 >> 0xbf,0) == '\0';
      bVar57 = (auVar107 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar55 = -1 < auVar107[0x1f];
      if (((((((!bVar63 || !bVar64) || !bVar62) || !bVar61) || !bVar59) || !bVar58) || !bVar57) ||
          !bVar55) {
        auVar175._8_4_ = 0x7f800000;
        auVar175._0_8_ = 0x7f8000007f800000;
        auVar175._12_4_ = 0x7f800000;
        auVar175._16_4_ = 0x7f800000;
        auVar175._20_4_ = 0x7f800000;
        auVar175._24_4_ = 0x7f800000;
        auVar175._28_4_ = 0x7f800000;
        auVar114 = vblendvps_avx(auVar175,auVar114,auVar265);
        auVar107 = vshufps_avx(auVar114,auVar114,0xb1);
        auVar107 = vminps_avx(auVar114,auVar107);
        auVar12 = vshufpd_avx(auVar107,auVar107,5);
        auVar107 = vminps_avx(auVar107,auVar12);
        auVar12 = vpermpd_avx2(auVar107,0x4e);
        auVar107 = vminps_avx(auVar107,auVar12);
        auVar114 = vcmpps_avx(auVar114,auVar107,0);
        auVar107 = auVar265 & auVar114;
        if ((((((((auVar107 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar107 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar107 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar107 >> 0x7f,0) != '\0') ||
              (auVar107 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar107 >> 0xbf,0) != '\0') ||
            (auVar107 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar107[0x1f] < '\0') {
          auVar265 = vandps_avx(auVar114,auVar265);
        }
        fVar125 = afStack_140[uVar86 * 0x18 + 1];
        local_760 = (ulong)auStack_138[uVar86 * 0x18];
        uVar83 = vmovmskps_avx(auVar265);
        iVar79 = 0;
        for (; (uVar83 & 1) == 0; uVar83 = uVar83 >> 1 | 0x80000000) {
          iVar79 = iVar79 + 1;
        }
        fVar292 = afStack_140[uVar86 * 0x18];
        auVar118._4_4_ = fVar292;
        auVar118._0_4_ = fVar292;
        auVar118._8_4_ = fVar292;
        auVar118._12_4_ = fVar292;
        auVar118._16_4_ = fVar292;
        auVar118._20_4_ = fVar292;
        auVar118._24_4_ = fVar292;
        auVar118._28_4_ = fVar292;
        *(undefined4 *)(local_480 + (uint)(iVar79 << 2)) = 0;
        *(RTCHitN (*) [32])(auStack_180 + lVar82) = local_480;
        uVar83 = uVar80 - 1;
        if (((((((((undefined1  [32])local_480 >> 0x1f & (undefined1  [32])0x1) !=
                  (undefined1  [32])0x0 ||
                 ((undefined1  [32])local_480 >> 0x3f & (undefined1  [32])0x1) !=
                 (undefined1  [32])0x0) ||
                ((undefined1  [32])local_480 >> 0x5f & (undefined1  [32])0x1) !=
                (undefined1  [32])0x0) || SUB321((undefined1  [32])local_480 >> 0x7f,0) != '\0') ||
              ((undefined1  [32])local_480 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
              ) || SUB321((undefined1  [32])local_480 >> 0xbf,0) != '\0') ||
            ((undefined1  [32])local_480 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0)
            || local_480[0x1f] < '\0') {
          uVar83 = uVar80;
        }
        fVar125 = fVar125 - fVar292;
        auVar153._4_4_ = fVar125;
        auVar153._0_4_ = fVar125;
        auVar153._8_4_ = fVar125;
        auVar153._12_4_ = fVar125;
        auVar153._16_4_ = fVar125;
        auVar153._20_4_ = fVar125;
        auVar153._24_4_ = fVar125;
        auVar153._28_4_ = fVar125;
        auVar99 = vfmadd132ps_fma(auVar153,auVar118,_DAT_02020f20);
        local_4c0 = ZEXT1632(auVar99);
        local_8e0._8_8_ = 0;
        local_8e0._0_8_ = *(ulong *)(local_4c0 + (uint)(iVar79 << 2));
        uVar86 = (ulong)uVar83;
      }
    } while (((((((bVar63 && bVar64) && bVar62) && bVar61) && bVar59) && bVar58) && bVar57) &&
             bVar55);
    auVar265._8_8_ = uStack_518;
    auVar265._0_8_ = local_520;
    auVar265._16_8_ = uStack_510;
    auVar265._24_8_ = uStack_508;
    uVar81 = local_760;
    auVar114 = auVar285;
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }